

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiMBIntersectorK<4,4>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::BSplineCurveT,4,8>,embree::avx512::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  int iVar7;
  __int_type_conflict _Var8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined8 uVar21;
  long lVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  byte bVar58;
  long lVar59;
  long lVar60;
  ulong uVar61;
  ulong uVar62;
  Geometry *pGVar63;
  uint uVar64;
  Geometry *geometry;
  long lVar65;
  ulong uVar66;
  byte bVar67;
  ulong uVar68;
  ulong uVar69;
  float fVar70;
  float fVar71;
  float fVar118;
  float fVar120;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  float fVar119;
  float fVar121;
  float fVar123;
  float fVar124;
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  float fVar122;
  float fVar125;
  float fVar126;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined4 uVar127;
  float fVar136;
  float fVar137;
  vint4 bi_2;
  undefined1 auVar128 [16];
  float fVar138;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined8 uVar139;
  vint4 bi_1;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  vint4 bi;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar150;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  vint4 ai_2;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  vint4 ai_1;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  float fVar168;
  float fVar171;
  vint4 ai;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  undefined1 auVar185 [64];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  undefined1 auVar195 [16];
  undefined1 auVar196 [64];
  undefined1 auVar197 [64];
  undefined1 auVar198 [64];
  undefined1 auVar199 [64];
  undefined1 auVar200 [64];
  undefined1 auVar201 [64];
  RTCFilterFunctionNArguments args;
  float old_t;
  float old_t_1;
  undefined1 local_610 [16];
  ulong local_5f8;
  undefined1 local_5f0 [16];
  Geometry *local_5e0;
  Precalculations *local_5d8;
  RTCFilterFunctionNArguments local_5d0;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_550 [16];
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [16];
  LinearSpace3fa *local_470;
  Primitive *local_468;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [8];
  float fStack_3a8;
  float fStack_3a4;
  uint local_3a0;
  uint uStack_39c;
  uint uStack_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  uint uStack_388;
  uint uStack_384;
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined4 local_350;
  undefined4 uStack_34c;
  undefined4 uStack_348;
  undefined4 uStack_344;
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  undefined1 local_320 [16];
  undefined4 local_310;
  undefined4 uStack_30c;
  undefined4 uStack_308;
  undefined4 uStack_304;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined1 local_2f0 [16];
  uint local_2e0;
  uint uStack_2dc;
  uint uStack_2d8;
  uint uStack_2d4;
  uint uStack_2d0;
  uint uStack_2cc;
  uint uStack_2c8;
  uint uStack_2c4;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_290 [16];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined4 local_220;
  int local_21c;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined4 uStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar6 = prim[1];
  uVar69 = (ulong)(byte)PVar6;
  lVar22 = uVar69 * 0x25;
  fVar150 = *(float *)(prim + lVar22 + 0x12);
  auVar76 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar76 = vinsertps_avx(auVar76,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar75 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar76 = vsubps_avx(auVar76,*(undefined1 (*) [16])(prim + lVar22 + 6));
  auVar151._0_4_ = fVar150 * auVar76._0_4_;
  auVar151._4_4_ = fVar150 * auVar76._4_4_;
  auVar151._8_4_ = fVar150 * auVar76._8_4_;
  auVar151._12_4_ = fVar150 * auVar76._12_4_;
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 4 + 6)));
  auVar128._0_4_ = fVar150 * auVar75._0_4_;
  auVar128._4_4_ = fVar150 * auVar75._4_4_;
  auVar128._8_4_ = fVar150 * auVar75._8_4_;
  auVar128._12_4_ = fVar150 * auVar75._12_4_;
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 5 + 6)));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 6 + 6)));
  auVar195 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0xf + 6)));
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar195 = vcvtdq2ps_avx(auVar195);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar69 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0x1a + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0x1b + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0x1c + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar165._4_4_ = auVar128._0_4_;
  auVar165._0_4_ = auVar128._0_4_;
  auVar165._8_4_ = auVar128._0_4_;
  auVar165._12_4_ = auVar128._0_4_;
  auVar78 = vshufps_avx(auVar128,auVar128,0x55);
  auVar79 = vshufps_avx(auVar128,auVar128,0xaa);
  fVar150 = auVar79._0_4_;
  auVar145._0_4_ = fVar150 * auVar77._0_4_;
  fVar136 = auVar79._4_4_;
  auVar145._4_4_ = fVar136 * auVar77._4_4_;
  fVar137 = auVar79._8_4_;
  auVar145._8_4_ = fVar137 * auVar77._8_4_;
  fVar138 = auVar79._12_4_;
  auVar145._12_4_ = fVar138 * auVar77._12_4_;
  auVar140._0_4_ = auVar17._0_4_ * fVar150;
  auVar140._4_4_ = auVar17._4_4_ * fVar136;
  auVar140._8_4_ = auVar17._8_4_ * fVar137;
  auVar140._12_4_ = auVar17._12_4_ * fVar138;
  auVar129._0_4_ = auVar20._0_4_ * fVar150;
  auVar129._4_4_ = auVar20._4_4_ * fVar136;
  auVar129._8_4_ = auVar20._8_4_ * fVar137;
  auVar129._12_4_ = auVar20._12_4_ * fVar138;
  auVar79 = vfmadd231ps_fma(auVar145,auVar78,auVar75);
  auVar24 = vfmadd231ps_fma(auVar140,auVar78,auVar16);
  auVar78 = vfmadd231ps_fma(auVar129,auVar19,auVar78);
  auVar25 = vfmadd231ps_fma(auVar79,auVar165,auVar76);
  auVar24 = vfmadd231ps_fma(auVar24,auVar165,auVar195);
  auVar80 = vfmadd231ps_fma(auVar78,auVar18,auVar165);
  auVar183._4_4_ = auVar151._0_4_;
  auVar183._0_4_ = auVar151._0_4_;
  auVar183._8_4_ = auVar151._0_4_;
  auVar183._12_4_ = auVar151._0_4_;
  auVar78 = vshufps_avx(auVar151,auVar151,0x55);
  auVar79 = vshufps_avx(auVar151,auVar151,0xaa);
  fVar150 = auVar79._0_4_;
  auVar166._0_4_ = fVar150 * auVar77._0_4_;
  fVar136 = auVar79._4_4_;
  auVar166._4_4_ = fVar136 * auVar77._4_4_;
  fVar137 = auVar79._8_4_;
  auVar166._8_4_ = fVar137 * auVar77._8_4_;
  fVar138 = auVar79._12_4_;
  auVar166._12_4_ = fVar138 * auVar77._12_4_;
  auVar155._0_4_ = auVar17._0_4_ * fVar150;
  auVar155._4_4_ = auVar17._4_4_ * fVar136;
  auVar155._8_4_ = auVar17._8_4_ * fVar137;
  auVar155._12_4_ = auVar17._12_4_ * fVar138;
  auVar152._0_4_ = auVar20._0_4_ * fVar150;
  auVar152._4_4_ = auVar20._4_4_ * fVar136;
  auVar152._8_4_ = auVar20._8_4_ * fVar137;
  auVar152._12_4_ = auVar20._12_4_ * fVar138;
  auVar75 = vfmadd231ps_fma(auVar166,auVar78,auVar75);
  auVar77 = vfmadd231ps_fma(auVar155,auVar78,auVar16);
  auVar16 = vfmadd231ps_fma(auVar152,auVar78,auVar19);
  auVar26 = vfmadd231ps_fma(auVar75,auVar183,auVar76);
  auVar128 = vfmadd231ps_fma(auVar77,auVar183,auVar195);
  auVar175._8_4_ = 0x7fffffff;
  auVar175._0_8_ = 0x7fffffff7fffffff;
  auVar175._12_4_ = 0x7fffffff;
  auVar129 = vfmadd231ps_fma(auVar16,auVar183,auVar18);
  auVar76 = vandps_avx(auVar175,auVar25);
  auVar172._8_4_ = 0x219392ef;
  auVar172._0_8_ = 0x219392ef219392ef;
  auVar172._12_4_ = 0x219392ef;
  uVar66 = vcmpps_avx512vl(auVar76,auVar172,1);
  bVar10 = (bool)((byte)uVar66 & 1);
  auVar72._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar25._0_4_;
  bVar10 = (bool)((byte)(uVar66 >> 1) & 1);
  auVar72._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar25._4_4_;
  bVar10 = (bool)((byte)(uVar66 >> 2) & 1);
  auVar72._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar25._8_4_;
  bVar10 = (bool)((byte)(uVar66 >> 3) & 1);
  auVar72._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar25._12_4_;
  auVar76 = vandps_avx(auVar175,auVar24);
  uVar66 = vcmpps_avx512vl(auVar76,auVar172,1);
  bVar10 = (bool)((byte)uVar66 & 1);
  auVar73._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar24._0_4_;
  bVar10 = (bool)((byte)(uVar66 >> 1) & 1);
  auVar73._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar24._4_4_;
  bVar10 = (bool)((byte)(uVar66 >> 2) & 1);
  auVar73._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar24._8_4_;
  bVar10 = (bool)((byte)(uVar66 >> 3) & 1);
  auVar73._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar24._12_4_;
  auVar76 = vandps_avx(auVar175,auVar80);
  uVar66 = vcmpps_avx512vl(auVar76,auVar172,1);
  bVar10 = (bool)((byte)uVar66 & 1);
  auVar74._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar80._0_4_;
  bVar10 = (bool)((byte)(uVar66 >> 1) & 1);
  auVar74._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar80._4_4_;
  bVar10 = (bool)((byte)(uVar66 >> 2) & 1);
  auVar74._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar80._8_4_;
  bVar10 = (bool)((byte)(uVar66 >> 3) & 1);
  auVar74._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar80._12_4_;
  auVar75 = vrcp14ps_avx512vl(auVar72);
  auVar173._8_4_ = 0x3f800000;
  auVar173._0_8_ = 0x3f8000003f800000;
  auVar173._12_4_ = 0x3f800000;
  auVar76 = vfnmadd213ps_fma(auVar72,auVar75,auVar173);
  auVar25 = vfmadd132ps_fma(auVar76,auVar75,auVar75);
  auVar75 = vrcp14ps_avx512vl(auVar73);
  auVar76 = vfnmadd213ps_fma(auVar73,auVar75,auVar173);
  auVar80 = vfmadd132ps_fma(auVar76,auVar75,auVar75);
  auVar75 = vrcp14ps_avx512vl(auVar74);
  auVar76 = vfnmadd213ps_fma(auVar74,auVar75,auVar173);
  auVar23 = vfmadd132ps_fma(auVar76,auVar75,auVar75);
  fVar150 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar22 + 0x16)) *
            *(float *)(prim + lVar22 + 0x1a);
  auVar169._4_4_ = fVar150;
  auVar169._0_4_ = fVar150;
  auVar169._8_4_ = fVar150;
  auVar169._12_4_ = fVar150;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar69 * 7 + 6);
  auVar76 = vpmovsxwd_avx(auVar76);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar69 * 0xb + 6);
  auVar75 = vpmovsxwd_avx(auVar75);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar195 = vsubps_avx(auVar75,auVar76);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar69 * 9 + 6);
  auVar75 = vpmovsxwd_avx(auVar77);
  auVar77 = vfmadd213ps_fma(auVar195,auVar169,auVar76);
  auVar76 = vcvtdq2ps_avx(auVar75);
  auVar195._8_8_ = 0;
  auVar195._0_8_ = *(ulong *)(prim + uVar69 * 0xd + 6);
  auVar75 = vpmovsxwd_avx(auVar195);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar76);
  auVar195 = vfmadd213ps_fma(auVar75,auVar169,auVar76);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar69 * 0x12 + 6);
  auVar76 = vpmovsxwd_avx(auVar16);
  auVar76 = vcvtdq2ps_avx(auVar76);
  uVar66 = (ulong)(uint)((int)(uVar69 * 5) << 2);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar69 * 2 + uVar66 + 6);
  auVar75 = vpmovsxwd_avx(auVar17);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar76);
  auVar16 = vfmadd213ps_fma(auVar75,auVar169,auVar76);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar66 + 6);
  auVar76 = vpmovsxwd_avx(auVar18);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar69 * 0x18 + 6);
  auVar75 = vpmovsxwd_avx(auVar19);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar76);
  auVar17 = vfmadd213ps_fma(auVar75,auVar169,auVar76);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar69 * 0x1d + 6);
  auVar76 = vpmovsxwd_avx(auVar20);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar69 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar75 = vpmovsxwd_avx(auVar78);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar76);
  auVar18 = vfmadd213ps_fma(auVar75,auVar169,auVar76);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar69) + 6);
  auVar76 = vpmovsxwd_avx(auVar79);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar69 * 0x23 + 6);
  auVar75 = vpmovsxwd_avx(auVar24);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar76);
  auVar75 = vfmadd213ps_fma(auVar75,auVar169,auVar76);
  auVar76 = vsubps_avx(auVar77,auVar26);
  auVar170._0_4_ = auVar25._0_4_ * auVar76._0_4_;
  auVar170._4_4_ = auVar25._4_4_ * auVar76._4_4_;
  auVar170._8_4_ = auVar25._8_4_ * auVar76._8_4_;
  auVar170._12_4_ = auVar25._12_4_ * auVar76._12_4_;
  auVar76 = vsubps_avx(auVar195,auVar26);
  auVar146._0_4_ = auVar25._0_4_ * auVar76._0_4_;
  auVar146._4_4_ = auVar25._4_4_ * auVar76._4_4_;
  auVar146._8_4_ = auVar25._8_4_ * auVar76._8_4_;
  auVar146._12_4_ = auVar25._12_4_ * auVar76._12_4_;
  auVar76 = vsubps_avx(auVar16,auVar128);
  auVar167._0_4_ = auVar80._0_4_ * auVar76._0_4_;
  auVar167._4_4_ = auVar80._4_4_ * auVar76._4_4_;
  auVar167._8_4_ = auVar80._8_4_ * auVar76._8_4_;
  auVar167._12_4_ = auVar80._12_4_ * auVar76._12_4_;
  auVar76 = vsubps_avx(auVar17,auVar128);
  auVar141._0_4_ = auVar80._0_4_ * auVar76._0_4_;
  auVar141._4_4_ = auVar80._4_4_ * auVar76._4_4_;
  auVar141._8_4_ = auVar80._8_4_ * auVar76._8_4_;
  auVar141._12_4_ = auVar80._12_4_ * auVar76._12_4_;
  auVar76 = vsubps_avx(auVar18,auVar129);
  auVar156._0_4_ = auVar23._0_4_ * auVar76._0_4_;
  auVar156._4_4_ = auVar23._4_4_ * auVar76._4_4_;
  auVar156._8_4_ = auVar23._8_4_ * auVar76._8_4_;
  auVar156._12_4_ = auVar23._12_4_ * auVar76._12_4_;
  auVar76 = vsubps_avx(auVar75,auVar129);
  auVar130._0_4_ = auVar23._0_4_ * auVar76._0_4_;
  auVar130._4_4_ = auVar23._4_4_ * auVar76._4_4_;
  auVar130._8_4_ = auVar23._8_4_ * auVar76._8_4_;
  auVar130._12_4_ = auVar23._12_4_ * auVar76._12_4_;
  auVar76 = vpminsd_avx(auVar170,auVar146);
  auVar75 = vpminsd_avx(auVar167,auVar141);
  auVar76 = vmaxps_avx(auVar76,auVar75);
  auVar75 = vpminsd_avx(auVar156,auVar130);
  uVar127 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar25._4_4_ = uVar127;
  auVar25._0_4_ = uVar127;
  auVar25._8_4_ = uVar127;
  auVar25._12_4_ = uVar127;
  auVar75 = vmaxps_avx512vl(auVar75,auVar25);
  auVar76 = vmaxps_avx(auVar76,auVar75);
  auVar80._8_4_ = 0x3f7ffffa;
  auVar80._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar80._12_4_ = 0x3f7ffffa;
  local_290 = vmulps_avx512vl(auVar76,auVar80);
  auVar76 = vpmaxsd_avx(auVar170,auVar146);
  auVar75 = vpmaxsd_avx(auVar167,auVar141);
  auVar76 = vminps_avx(auVar76,auVar75);
  auVar75 = vpmaxsd_avx(auVar156,auVar130);
  uVar127 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar23._4_4_ = uVar127;
  auVar23._0_4_ = uVar127;
  auVar23._8_4_ = uVar127;
  auVar23._12_4_ = uVar127;
  auVar75 = vminps_avx512vl(auVar75,auVar23);
  auVar76 = vminps_avx(auVar76,auVar75);
  auVar26._8_4_ = 0x3f800003;
  auVar26._0_8_ = 0x3f8000033f800003;
  auVar26._12_4_ = 0x3f800003;
  auVar76 = vmulps_avx512vl(auVar76,auVar26);
  auVar75 = vpbroadcastd_avx512vl();
  uVar139 = vcmpps_avx512vl(local_290,auVar76,2);
  uVar66 = vpcmpgtd_avx512vl(auVar75,_DAT_01f7fcf0);
  uVar66 = ((byte)uVar139 & 0xf) & uVar66;
  if ((char)uVar66 == '\0') {
    bVar67 = 0;
  }
  else {
    local_470 = pre->ray_space + k;
    local_3c0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_5d8 = pre;
    local_468 = prim;
    do {
      lVar22 = 0;
      for (uVar69 = uVar66; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x8000000000000000) {
        lVar22 = lVar22 + 1;
      }
      local_5f8 = (ulong)*(uint *)(local_468 + 2);
      pGVar63 = (context->scene->geometries).items[local_5f8].ptr;
      local_540._0_8_ = CONCAT44(0,*(uint *)(local_468 + lVar22 * 4 + 6));
      uVar69 = (ulong)*(uint *)(*(long *)&pGVar63->field_0x58 +
                               CONCAT44(0,*(uint *)(local_468 + lVar22 * 4 + 6)) *
                               pGVar63[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar150 = (pGVar63->time_range).lower;
      fVar150 = pGVar63->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x70) - fVar150) /
                ((pGVar63->time_range).upper - fVar150));
      auVar76 = vroundss_avx(ZEXT416((uint)fVar150),ZEXT416((uint)fVar150),9);
      auVar76 = vminss_avx(auVar76,ZEXT416((uint)(pGVar63->fnumTimeSegments + -1.0)));
      auVar76 = vmaxss_avx(ZEXT816(0) << 0x20,auVar76);
      fVar150 = fVar150 - auVar76._0_4_;
      _Var8 = pGVar63[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar60 = (long)(int)auVar76._0_4_ * 0x38;
      lVar22 = *(long *)(_Var8 + 0x10 + lVar60);
      lVar65 = *(long *)(_Var8 + 0x38 + lVar60);
      lVar59 = *(long *)(_Var8 + 0x48 + lVar60);
      auVar142._4_4_ = fVar150;
      auVar142._0_4_ = fVar150;
      auVar142._8_4_ = fVar150;
      auVar142._12_4_ = fVar150;
      pfVar3 = (float *)(lVar65 + uVar69 * lVar59);
      auVar176._0_4_ = fVar150 * *pfVar3;
      auVar176._4_4_ = fVar150 * pfVar3[1];
      auVar176._8_4_ = fVar150 * pfVar3[2];
      auVar176._12_4_ = fVar150 * pfVar3[3];
      pfVar3 = (float *)(lVar65 + (uVar69 + 1) * lVar59);
      auVar177._0_4_ = fVar150 * *pfVar3;
      auVar177._4_4_ = fVar150 * pfVar3[1];
      auVar177._8_4_ = fVar150 * pfVar3[2];
      auVar177._12_4_ = fVar150 * pfVar3[3];
      uVar61 = (uVar69 + 2) * lVar59;
      auVar76 = vmulps_avx512vl(auVar142,*(undefined1 (*) [16])(lVar65 + uVar61));
      auVar75 = vmulps_avx512vl(auVar142,*(undefined1 (*) [16])(lVar65 + lVar59 * (uVar69 + 3)));
      lVar65 = *(long *)(_Var8 + lVar60);
      fVar150 = 1.0 - fVar150;
      auVar131._4_4_ = fVar150;
      auVar131._0_4_ = fVar150;
      auVar131._8_4_ = fVar150;
      auVar131._12_4_ = fVar150;
      local_510 = vfmadd231ps_fma(auVar176,auVar131,*(undefined1 (*) [16])(lVar65 + lVar22 * uVar69)
                                 );
      local_520 = vfmadd231ps_fma(auVar177,auVar131,
                                  *(undefined1 (*) [16])(lVar65 + lVar22 * (uVar69 + 1)));
      local_530 = vfmadd231ps_avx512vl
                            (auVar76,auVar131,*(undefined1 (*) [16])(lVar65 + lVar22 * (uVar69 + 2))
                            );
      _local_3b0 = vfmadd231ps_avx512vl
                             (auVar75,auVar131,
                              *(undefined1 (*) [16])(lVar65 + lVar22 * (uVar69 + 3)));
      iVar7 = (int)pGVar63[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar76 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10))
                              ,0x1c);
      lVar22 = (long)iVar7 * 0x44;
      auVar76 = vinsertps_avx(auVar76,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar77 = vsubps_avx(local_510,auVar76);
      uVar127 = auVar77._0_4_;
      auVar147._4_4_ = uVar127;
      auVar147._0_4_ = uVar127;
      auVar147._8_4_ = uVar127;
      auVar147._12_4_ = uVar127;
      auVar75 = vshufps_avx(auVar77,auVar77,0x55);
      aVar4 = (local_470->vx).field_0;
      aVar5 = (local_470->vy).field_0;
      fVar150 = (local_470->vz).field_0.m128[0];
      fVar136 = *(float *)((long)&(local_470->vz).field_0 + 4);
      fVar137 = *(float *)((long)&(local_470->vz).field_0 + 8);
      fVar138 = *(float *)((long)&(local_470->vz).field_0 + 0xc);
      auVar77 = vshufps_avx(auVar77,auVar77,0xaa);
      auVar179._0_4_ = fVar150 * auVar77._0_4_;
      auVar179._4_4_ = fVar136 * auVar77._4_4_;
      auVar179._8_4_ = fVar137 * auVar77._8_4_;
      auVar179._12_4_ = fVar138 * auVar77._12_4_;
      auVar75 = vfmadd231ps_fma(auVar179,(undefined1  [16])aVar5,auVar75);
      auVar195 = vfmadd231ps_fma(auVar75,(undefined1  [16])aVar4,auVar147);
      auVar77 = vsubps_avx(local_520,auVar76);
      uVar127 = auVar77._0_4_;
      auVar148._4_4_ = uVar127;
      auVar148._0_4_ = uVar127;
      auVar148._8_4_ = uVar127;
      auVar148._12_4_ = uVar127;
      auVar75 = vshufps_avx(auVar77,auVar77,0x55);
      auVar77 = vshufps_avx(auVar77,auVar77,0xaa);
      auVar180._0_4_ = fVar150 * auVar77._0_4_;
      auVar180._4_4_ = fVar136 * auVar77._4_4_;
      auVar180._8_4_ = fVar137 * auVar77._8_4_;
      auVar180._12_4_ = fVar138 * auVar77._12_4_;
      auVar75 = vfmadd231ps_fma(auVar180,(undefined1  [16])aVar5,auVar75);
      auVar16 = vfmadd231ps_fma(auVar75,(undefined1  [16])aVar4,auVar148);
      auVar77 = vsubps_avx512vl(local_530,auVar76);
      uVar127 = auVar77._0_4_;
      auVar149._4_4_ = uVar127;
      auVar149._0_4_ = uVar127;
      auVar149._8_4_ = uVar127;
      auVar149._12_4_ = uVar127;
      auVar75 = vshufps_avx(auVar77,auVar77,0x55);
      auVar77 = vshufps_avx(auVar77,auVar77,0xaa);
      auVar181._0_4_ = fVar150 * auVar77._0_4_;
      auVar181._4_4_ = fVar136 * auVar77._4_4_;
      auVar181._8_4_ = fVar137 * auVar77._8_4_;
      auVar181._12_4_ = fVar138 * auVar77._12_4_;
      auVar75 = vfmadd231ps_fma(auVar181,(undefined1  [16])aVar5,auVar75);
      auVar77 = vfmadd231ps_fma(auVar75,(undefined1  [16])aVar4,auVar149);
      auVar75 = vsubps_avx512vl(_local_3b0,auVar76);
      uVar127 = auVar75._0_4_;
      auVar143._4_4_ = uVar127;
      auVar143._0_4_ = uVar127;
      auVar143._8_4_ = uVar127;
      auVar143._12_4_ = uVar127;
      auVar76 = vshufps_avx(auVar75,auVar75,0x55);
      auVar75 = vshufps_avx(auVar75,auVar75,0xaa);
      auVar186._0_4_ = fVar150 * auVar75._0_4_;
      auVar186._4_4_ = fVar136 * auVar75._4_4_;
      auVar186._8_4_ = fVar137 * auVar75._8_4_;
      auVar186._12_4_ = fVar138 * auVar75._12_4_;
      auVar76 = vfmadd231ps_fma(auVar186,(undefined1  [16])aVar5,auVar76);
      auVar17 = vfmadd231ps_fma(auVar76,(undefined1  [16])aVar4,auVar143);
      auVar96 = *(undefined1 (*) [32])(bspline_basis0 + lVar22);
      uVar127 = auVar195._0_4_;
      local_400._4_4_ = uVar127;
      local_400._0_4_ = uVar127;
      local_400._8_4_ = uVar127;
      local_400._12_4_ = uVar127;
      local_400._16_4_ = uVar127;
      local_400._20_4_ = uVar127;
      local_400._24_4_ = uVar127;
      local_400._28_4_ = uVar127;
      auVar98 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0x484);
      auVar81._8_4_ = 1;
      auVar81._0_8_ = 0x100000001;
      auVar81._12_4_ = 1;
      auVar81._16_4_ = 1;
      auVar81._20_4_ = 1;
      auVar81._24_4_ = 1;
      auVar81._28_4_ = 1;
      local_420 = vpermps_avx2(auVar81,ZEXT1632(auVar195));
      uVar127 = auVar16._0_4_;
      local_580._4_4_ = uVar127;
      local_580._0_4_ = uVar127;
      local_580._8_4_ = uVar127;
      local_580._12_4_ = uVar127;
      local_580._16_4_ = uVar127;
      local_580._20_4_ = uVar127;
      local_580._24_4_ = uVar127;
      local_580._28_4_ = uVar127;
      local_5a0 = vpermps_avx512vl(auVar81,ZEXT1632(auVar16));
      auVar94 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0x908);
      local_4a0 = vbroadcastss_avx512vl(auVar77);
      auVar201 = ZEXT3264(local_4a0);
      local_4c0 = vpermps_avx512vl(auVar81,ZEXT1632(auVar77));
      auVar93 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0xd8c);
      local_4e0 = vbroadcastss_avx512vl(auVar17);
      auVar198 = ZEXT3264(local_4e0);
      local_500 = vpermps_avx512vl(auVar81,ZEXT1632(auVar17));
      auVar199 = ZEXT3264(local_500);
      auVar81 = vmulps_avx512vl(local_4e0,auVar93);
      auVar82 = vmulps_avx512vl(local_500,auVar93);
      auVar81 = vfmadd231ps_avx512vl(auVar81,auVar94,local_4a0);
      auVar82 = vfmadd231ps_avx512vl(auVar82,auVar94,local_4c0);
      auVar76 = vfmadd231ps_fma(auVar81,auVar98,local_580);
      auVar83 = vfmadd231ps_avx512vl(auVar82,auVar98,local_5a0);
      auVar84 = vfmadd231ps_avx512vl(ZEXT1632(auVar76),auVar96,local_400);
      auVar81 = *(undefined1 (*) [32])(bspline_basis1 + lVar22);
      auVar82 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0x484);
      auVar92 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0x908);
      auVar85 = vfmadd231ps_avx512vl(auVar83,auVar96,local_420);
      auVar83 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0xd8c);
      auVar86 = vmulps_avx512vl(local_4e0,auVar83);
      auVar87 = vmulps_avx512vl(local_500,auVar83);
      auVar86 = vfmadd231ps_avx512vl(auVar86,auVar92,local_4a0);
      auVar87 = vfmadd231ps_avx512vl(auVar87,auVar92,local_4c0);
      auVar86 = vfmadd231ps_avx512vl(auVar86,auVar82,local_580);
      auVar87 = vfmadd231ps_avx512vl(auVar87,auVar82,local_5a0);
      auVar18 = vfmadd231ps_fma(auVar86,auVar81,local_400);
      auVar19 = vfmadd231ps_fma(auVar87,auVar81,local_420);
      auVar87 = vsubps_avx512vl(ZEXT1632(auVar18),auVar84);
      auVar88 = vsubps_avx512vl(ZEXT1632(auVar19),auVar85);
      auVar86 = vmulps_avx512vl(auVar85,auVar87);
      auVar89 = vmulps_avx512vl(auVar84,auVar88);
      auVar86 = vsubps_avx512vl(auVar86,auVar89);
      auVar76 = vshufps_avx(local_510,local_510,0xff);
      uVar139 = auVar76._0_8_;
      local_80._8_8_ = uVar139;
      local_80._0_8_ = uVar139;
      local_80._16_8_ = uVar139;
      local_80._24_8_ = uVar139;
      auVar76 = vshufps_avx(local_520,local_520,0xff);
      local_a0 = vbroadcastsd_avx512vl(auVar76);
      auVar76 = vshufps_avx512vl(local_530,local_530,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar76);
      auVar76 = vshufps_avx512vl(_local_3b0,_local_3b0,0xff);
      uVar139 = auVar76._0_8_;
      register0x000012c8 = uVar139;
      local_e0 = uVar139;
      register0x000012d0 = uVar139;
      register0x000012d8 = uVar139;
      auVar89 = vmulps_avx512vl(_local_e0,auVar93);
      auVar89 = vfmadd231ps_avx512vl(auVar89,auVar94,local_c0);
      auVar89 = vfmadd231ps_avx512vl(auVar89,auVar98,local_a0);
      auVar89 = vfmadd231ps_avx512vl(auVar89,auVar96,local_80);
      auVar90 = vmulps_avx512vl(_local_e0,auVar83);
      auVar90 = vfmadd231ps_avx512vl(auVar90,auVar92,local_c0);
      auVar90 = vfmadd231ps_avx512vl(auVar90,auVar82,local_a0);
      auVar20 = vfmadd231ps_fma(auVar90,auVar81,local_80);
      auVar90 = vmulps_avx512vl(auVar88,auVar88);
      auVar90 = vfmadd231ps_avx512vl(auVar90,auVar87,auVar87);
      auVar91 = vmaxps_avx512vl(auVar89,ZEXT1632(auVar20));
      auVar91 = vmulps_avx512vl(auVar91,auVar91);
      auVar90 = vmulps_avx512vl(auVar91,auVar90);
      auVar86 = vmulps_avx512vl(auVar86,auVar86);
      uVar139 = vcmpps_avx512vl(auVar86,auVar90,2);
      auVar76 = vblendps_avx(auVar195,local_510,8);
      auVar78 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar75 = vandps_avx512vl(auVar76,auVar78);
      auVar76 = vblendps_avx(auVar16,local_520,8);
      auVar76 = vandps_avx512vl(auVar76,auVar78);
      auVar75 = vmaxps_avx(auVar75,auVar76);
      auVar76 = vblendps_avx(auVar77,local_530,8);
      auVar79 = vandps_avx512vl(auVar76,auVar78);
      auVar76 = vblendps_avx(auVar17,_local_3b0,8);
      auVar76 = vandps_avx512vl(auVar76,auVar78);
      auVar76 = vmaxps_avx(auVar79,auVar76);
      auVar76 = vmaxps_avx(auVar75,auVar76);
      auVar75 = vmovshdup_avx(auVar76);
      auVar75 = vmaxss_avx(auVar75,auVar76);
      auVar76 = vshufpd_avx(auVar76,auVar76,1);
      auVar76 = vmaxss_avx(auVar76,auVar75);
      local_550 = vcvtsi2ss_avx512f(local_530,iVar7);
      auVar90._0_4_ = local_550._0_4_;
      auVar90._4_4_ = auVar90._0_4_;
      auVar90._8_4_ = auVar90._0_4_;
      auVar90._12_4_ = auVar90._0_4_;
      auVar90._16_4_ = auVar90._0_4_;
      auVar90._20_4_ = auVar90._0_4_;
      auVar90._24_4_ = auVar90._0_4_;
      auVar90._28_4_ = auVar90._0_4_;
      uVar21 = vcmpps_avx512vl(auVar90,_DAT_01faff40,0xe);
      bVar67 = (byte)uVar139 & (byte)uVar21;
      local_380 = auVar76._0_4_ * 4.7683716e-07;
      auVar86._8_4_ = 2;
      auVar86._0_8_ = 0x200000002;
      auVar86._12_4_ = 2;
      auVar86._16_4_ = 2;
      auVar86._20_4_ = 2;
      auVar86._24_4_ = 2;
      auVar86._28_4_ = 2;
      local_100 = vpermps_avx512vl(auVar86,ZEXT1632(auVar195));
      local_120 = vpermps_avx512vl(auVar86,ZEXT1632(auVar16));
      local_140 = vpermps_avx512vl(auVar86,ZEXT1632(auVar77));
      auVar86 = vpermps_avx2(auVar86,ZEXT1632(auVar17));
      uVar64 = *(uint *)(ray + k * 4 + 0x30);
      auVar75 = auVar87._0_16_;
      auVar76 = ZEXT416((uint)local_380);
      if (bVar67 == 0) {
        uVar61 = 0;
        auVar76 = vxorps_avx512vl(auVar75,auVar75);
        auVar196 = ZEXT1664(auVar76);
        auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar192 = ZEXT3264(auVar96);
        auVar193 = ZEXT3264(local_400);
        auVar194 = ZEXT3264(local_420);
        auVar200 = ZEXT3264(local_580);
        auVar191 = ZEXT3264(local_5a0);
        auVar197 = ZEXT3264(local_4c0);
      }
      else {
        local_460._0_16_ = ZEXT416(uVar64);
        auVar83 = vmulps_avx512vl(auVar86,auVar83);
        auVar92 = vfmadd213ps_avx512vl(auVar92,local_140,auVar83);
        auVar82 = vfmadd213ps_avx512vl(auVar82,local_120,auVar92);
        auVar91 = vfmadd213ps_avx512vl(auVar81,local_100,auVar82);
        auVar93 = vmulps_avx512vl(auVar86,auVar93);
        auVar94 = vfmadd213ps_avx512vl(auVar94,local_140,auVar93);
        auVar82 = vfmadd213ps_avx512vl(auVar98,local_120,auVar94);
        auVar98 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0x1210);
        auVar94 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0x1694);
        auVar93 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0x1b18);
        auVar81 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0x1f9c);
        auVar95 = vfmadd213ps_avx512vl(auVar96,local_100,auVar82);
        auVar96 = vmulps_avx512vl(local_4e0,auVar81);
        auVar82 = vmulps_avx512vl(local_500,auVar81);
        auVar182._0_4_ = auVar86._0_4_ * auVar81._0_4_;
        auVar182._4_4_ = auVar86._4_4_ * auVar81._4_4_;
        auVar182._8_4_ = auVar86._8_4_ * auVar81._8_4_;
        auVar182._12_4_ = auVar86._12_4_ * auVar81._12_4_;
        auVar182._16_4_ = auVar86._16_4_ * auVar81._16_4_;
        auVar182._20_4_ = auVar86._20_4_ * auVar81._20_4_;
        auVar182._24_4_ = auVar86._24_4_ * auVar81._24_4_;
        auVar182._28_4_ = 0;
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar93,local_4a0);
        auVar81 = vfmadd231ps_avx512vl(auVar82,auVar93,local_4c0);
        auVar93 = vfmadd231ps_avx512vl(auVar182,local_140,auVar93);
        auVar200 = ZEXT3264(local_580);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar94,local_580);
        auVar191 = ZEXT3264(local_5a0);
        auVar81 = vfmadd231ps_avx512vl(auVar81,auVar94,local_5a0);
        auVar82 = vfmadd231ps_avx512vl(auVar93,local_120,auVar94);
        auVar92 = vfmadd231ps_avx512vl(auVar96,auVar98,local_400);
        auVar81 = vfmadd231ps_avx512vl(auVar81,auVar98,local_420);
        auVar96 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0x1210);
        auVar94 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0x1b18);
        auVar93 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0x1f9c);
        auVar82 = vfmadd231ps_avx512vl(auVar82,local_100,auVar98);
        auVar83 = vmulps_avx512vl(local_4e0,auVar93);
        auVar97 = vmulps_avx512vl(local_500,auVar93);
        auVar98._4_4_ = auVar86._4_4_ * auVar93._4_4_;
        auVar98._0_4_ = auVar86._0_4_ * auVar93._0_4_;
        auVar98._8_4_ = auVar86._8_4_ * auVar93._8_4_;
        auVar98._12_4_ = auVar86._12_4_ * auVar93._12_4_;
        auVar98._16_4_ = auVar86._16_4_ * auVar93._16_4_;
        auVar98._20_4_ = auVar86._20_4_ * auVar93._20_4_;
        auVar98._24_4_ = auVar86._24_4_ * auVar93._24_4_;
        auVar98._28_4_ = auVar93._28_4_;
        auVar93 = vfmadd231ps_avx512vl(auVar83,auVar94,local_4a0);
        auVar83 = vfmadd231ps_avx512vl(auVar97,auVar94,local_4c0);
        auVar94 = vfmadd231ps_avx512vl(auVar98,local_140,auVar94);
        auVar98 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0x1694);
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar98,local_580);
        auVar83 = vfmadd231ps_avx512vl(auVar83,auVar98,local_5a0);
        auVar98 = vfmadd231ps_avx512vl(auVar94,local_120,auVar98);
        auVar94 = vfmadd231ps_avx512vl(auVar93,auVar96,local_400);
        auVar93 = vfmadd231ps_avx512vl(auVar83,auVar96,local_420);
        auVar83 = vfmadd231ps_avx512vl(auVar98,local_100,auVar96);
        auVar187._8_4_ = 0x7fffffff;
        auVar187._0_8_ = 0x7fffffff7fffffff;
        auVar187._12_4_ = 0x7fffffff;
        auVar187._16_4_ = 0x7fffffff;
        auVar187._20_4_ = 0x7fffffff;
        auVar187._24_4_ = 0x7fffffff;
        auVar187._28_4_ = 0x7fffffff;
        auVar96 = vandps_avx(auVar92,auVar187);
        auVar98 = vandps_avx(auVar81,auVar187);
        auVar98 = vmaxps_avx(auVar96,auVar98);
        auVar96 = vandps_avx(auVar82,auVar187);
        auVar96 = vmaxps_avx(auVar98,auVar96);
        auVar82 = vbroadcastss_avx512vl(auVar76);
        uVar69 = vcmpps_avx512vl(auVar96,auVar82,1);
        bVar10 = (bool)((byte)uVar69 & 1);
        auVar97._0_4_ = (float)((uint)bVar10 * auVar87._0_4_ | (uint)!bVar10 * auVar92._0_4_);
        bVar10 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar97._4_4_ = (float)((uint)bVar10 * auVar87._4_4_ | (uint)!bVar10 * auVar92._4_4_);
        bVar10 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar97._8_4_ = (float)((uint)bVar10 * auVar87._8_4_ | (uint)!bVar10 * auVar92._8_4_);
        bVar10 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar97._12_4_ = (float)((uint)bVar10 * auVar87._12_4_ | (uint)!bVar10 * auVar92._12_4_);
        bVar10 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar97._16_4_ = (float)((uint)bVar10 * auVar87._16_4_ | (uint)!bVar10 * auVar92._16_4_);
        bVar10 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar97._20_4_ = (float)((uint)bVar10 * auVar87._20_4_ | (uint)!bVar10 * auVar92._20_4_);
        bVar10 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar97._24_4_ = (float)((uint)bVar10 * auVar87._24_4_ | (uint)!bVar10 * auVar92._24_4_);
        bVar10 = SUB81(uVar69 >> 7,0);
        auVar97._28_4_ = (uint)bVar10 * auVar87._28_4_ | (uint)!bVar10 * auVar92._28_4_;
        bVar10 = (bool)((byte)uVar69 & 1);
        auVar99._0_4_ = (float)((uint)bVar10 * auVar88._0_4_ | (uint)!bVar10 * auVar81._0_4_);
        bVar10 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar99._4_4_ = (float)((uint)bVar10 * auVar88._4_4_ | (uint)!bVar10 * auVar81._4_4_);
        bVar10 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar99._8_4_ = (float)((uint)bVar10 * auVar88._8_4_ | (uint)!bVar10 * auVar81._8_4_);
        bVar10 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar99._12_4_ = (float)((uint)bVar10 * auVar88._12_4_ | (uint)!bVar10 * auVar81._12_4_);
        bVar10 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar99._16_4_ = (float)((uint)bVar10 * auVar88._16_4_ | (uint)!bVar10 * auVar81._16_4_);
        bVar10 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar99._20_4_ = (float)((uint)bVar10 * auVar88._20_4_ | (uint)!bVar10 * auVar81._20_4_);
        bVar10 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar99._24_4_ = (float)((uint)bVar10 * auVar88._24_4_ | (uint)!bVar10 * auVar81._24_4_);
        bVar10 = SUB81(uVar69 >> 7,0);
        auVar99._28_4_ = (uint)bVar10 * auVar88._28_4_ | (uint)!bVar10 * auVar81._28_4_;
        auVar96 = vandps_avx(auVar187,auVar94);
        auVar98 = vandps_avx(auVar93,auVar187);
        auVar98 = vmaxps_avx(auVar96,auVar98);
        auVar96 = vandps_avx(auVar83,auVar187);
        auVar96 = vmaxps_avx(auVar98,auVar96);
        uVar69 = vcmpps_avx512vl(auVar96,auVar82,1);
        bVar10 = (bool)((byte)uVar69 & 1);
        auVar100._0_4_ = (float)((uint)bVar10 * auVar87._0_4_ | (uint)!bVar10 * auVar94._0_4_);
        bVar10 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar100._4_4_ = (float)((uint)bVar10 * auVar87._4_4_ | (uint)!bVar10 * auVar94._4_4_);
        bVar10 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar100._8_4_ = (float)((uint)bVar10 * auVar87._8_4_ | (uint)!bVar10 * auVar94._8_4_);
        bVar10 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar100._12_4_ = (float)((uint)bVar10 * auVar87._12_4_ | (uint)!bVar10 * auVar94._12_4_);
        bVar10 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar100._16_4_ = (float)((uint)bVar10 * auVar87._16_4_ | (uint)!bVar10 * auVar94._16_4_);
        bVar10 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar100._20_4_ = (float)((uint)bVar10 * auVar87._20_4_ | (uint)!bVar10 * auVar94._20_4_);
        bVar10 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar100._24_4_ = (float)((uint)bVar10 * auVar87._24_4_ | (uint)!bVar10 * auVar94._24_4_);
        bVar10 = SUB81(uVar69 >> 7,0);
        auVar100._28_4_ = (uint)bVar10 * auVar87._28_4_ | (uint)!bVar10 * auVar94._28_4_;
        bVar10 = (bool)((byte)uVar69 & 1);
        auVar101._0_4_ = (float)((uint)bVar10 * auVar88._0_4_ | (uint)!bVar10 * auVar93._0_4_);
        bVar10 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar101._4_4_ = (float)((uint)bVar10 * auVar88._4_4_ | (uint)!bVar10 * auVar93._4_4_);
        bVar10 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar101._8_4_ = (float)((uint)bVar10 * auVar88._8_4_ | (uint)!bVar10 * auVar93._8_4_);
        bVar10 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar101._12_4_ = (float)((uint)bVar10 * auVar88._12_4_ | (uint)!bVar10 * auVar93._12_4_);
        bVar10 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar101._16_4_ = (float)((uint)bVar10 * auVar88._16_4_ | (uint)!bVar10 * auVar93._16_4_);
        bVar10 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar101._20_4_ = (float)((uint)bVar10 * auVar88._20_4_ | (uint)!bVar10 * auVar93._20_4_);
        bVar10 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar101._24_4_ = (float)((uint)bVar10 * auVar88._24_4_ | (uint)!bVar10 * auVar93._24_4_);
        bVar10 = SUB81(uVar69 >> 7,0);
        auVar101._28_4_ = (uint)bVar10 * auVar88._28_4_ | (uint)!bVar10 * auVar93._28_4_;
        auVar80 = vxorps_avx512vl(auVar75,auVar75);
        auVar196 = ZEXT1664(auVar80);
        auVar96 = vfmadd213ps_avx512vl(auVar97,auVar97,ZEXT1632(auVar80));
        auVar75 = vfmadd231ps_fma(auVar96,auVar99,auVar99);
        auVar98 = vrsqrt14ps_avx512vl(ZEXT1632(auVar75));
        fVar150 = auVar98._0_4_;
        fVar136 = auVar98._4_4_;
        fVar137 = auVar98._8_4_;
        fVar138 = auVar98._12_4_;
        fVar168 = auVar98._16_4_;
        fVar171 = auVar98._20_4_;
        fVar70 = auVar98._24_4_;
        auVar96._4_4_ = fVar136 * fVar136 * fVar136 * auVar75._4_4_ * -0.5;
        auVar96._0_4_ = fVar150 * fVar150 * fVar150 * auVar75._0_4_ * -0.5;
        auVar96._8_4_ = fVar137 * fVar137 * fVar137 * auVar75._8_4_ * -0.5;
        auVar96._12_4_ = fVar138 * fVar138 * fVar138 * auVar75._12_4_ * -0.5;
        auVar96._16_4_ = fVar168 * fVar168 * fVar168 * -0.0;
        auVar96._20_4_ = fVar171 * fVar171 * fVar171 * -0.0;
        auVar96._24_4_ = fVar70 * fVar70 * fVar70 * -0.0;
        auVar96._28_4_ = auVar83._28_4_;
        auVar81 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar81,auVar98);
        auVar94._4_4_ = auVar99._4_4_ * auVar96._4_4_;
        auVar94._0_4_ = auVar99._0_4_ * auVar96._0_4_;
        auVar94._8_4_ = auVar99._8_4_ * auVar96._8_4_;
        auVar94._12_4_ = auVar99._12_4_ * auVar96._12_4_;
        auVar94._16_4_ = auVar99._16_4_ * auVar96._16_4_;
        auVar94._20_4_ = auVar99._20_4_ * auVar96._20_4_;
        auVar94._24_4_ = auVar99._24_4_ * auVar96._24_4_;
        auVar94._28_4_ = 0;
        auVar93._4_4_ = auVar96._4_4_ * -auVar97._4_4_;
        auVar93._0_4_ = auVar96._0_4_ * -auVar97._0_4_;
        auVar93._8_4_ = auVar96._8_4_ * -auVar97._8_4_;
        auVar93._12_4_ = auVar96._12_4_ * -auVar97._12_4_;
        auVar93._16_4_ = auVar96._16_4_ * -auVar97._16_4_;
        auVar93._20_4_ = auVar96._20_4_ * -auVar97._20_4_;
        auVar93._24_4_ = auVar96._24_4_ * -auVar97._24_4_;
        auVar93._28_4_ = auVar99._28_4_;
        auVar96 = vmulps_avx512vl(auVar96,ZEXT1632(auVar80));
        auVar87 = ZEXT1632(auVar80);
        auVar98 = vfmadd213ps_avx512vl(auVar100,auVar100,auVar87);
        auVar75 = vfmadd231ps_fma(auVar98,auVar101,auVar101);
        auVar98 = vrsqrt14ps_avx512vl(ZEXT1632(auVar75));
        fVar150 = auVar98._0_4_;
        fVar136 = auVar98._4_4_;
        fVar137 = auVar98._8_4_;
        fVar138 = auVar98._12_4_;
        fVar168 = auVar98._16_4_;
        fVar171 = auVar98._20_4_;
        fVar70 = auVar98._24_4_;
        auVar82._4_4_ = fVar136 * fVar136 * fVar136 * auVar75._4_4_ * -0.5;
        auVar82._0_4_ = fVar150 * fVar150 * fVar150 * auVar75._0_4_ * -0.5;
        auVar82._8_4_ = fVar137 * fVar137 * fVar137 * auVar75._8_4_ * -0.5;
        auVar82._12_4_ = fVar138 * fVar138 * fVar138 * auVar75._12_4_ * -0.5;
        auVar82._16_4_ = fVar168 * fVar168 * fVar168 * -0.0;
        auVar82._20_4_ = fVar171 * fVar171 * fVar171 * -0.0;
        auVar82._24_4_ = fVar70 * fVar70 * fVar70 * -0.0;
        auVar82._28_4_ = 0;
        auVar81 = vfmadd231ps_avx512vl(auVar82,auVar81,auVar98);
        auVar92._4_4_ = auVar101._4_4_ * auVar81._4_4_;
        auVar92._0_4_ = auVar101._0_4_ * auVar81._0_4_;
        auVar92._8_4_ = auVar101._8_4_ * auVar81._8_4_;
        auVar92._12_4_ = auVar101._12_4_ * auVar81._12_4_;
        auVar92._16_4_ = auVar101._16_4_ * auVar81._16_4_;
        auVar92._20_4_ = auVar101._20_4_ * auVar81._20_4_;
        auVar92._24_4_ = auVar101._24_4_ * auVar81._24_4_;
        auVar92._28_4_ = auVar98._28_4_;
        auVar83._4_4_ = -auVar100._4_4_ * auVar81._4_4_;
        auVar83._0_4_ = -auVar100._0_4_ * auVar81._0_4_;
        auVar83._8_4_ = -auVar100._8_4_ * auVar81._8_4_;
        auVar83._12_4_ = -auVar100._12_4_ * auVar81._12_4_;
        auVar83._16_4_ = -auVar100._16_4_ * auVar81._16_4_;
        auVar83._20_4_ = -auVar100._20_4_ * auVar81._20_4_;
        auVar83._24_4_ = -auVar100._24_4_ * auVar81._24_4_;
        auVar83._28_4_ = auVar100._28_4_ ^ 0x80000000;
        auVar98 = vmulps_avx512vl(auVar81,auVar87);
        auVar75 = vfmadd213ps_fma(auVar94,auVar89,auVar84);
        auVar77 = vfmadd213ps_fma(auVar93,auVar89,auVar85);
        auVar81 = vfmadd213ps_avx512vl(auVar96,auVar89,auVar95);
        auVar82 = vfmadd213ps_avx512vl(auVar92,ZEXT1632(auVar20),ZEXT1632(auVar18));
        auVar78 = vfnmadd213ps_fma(auVar94,auVar89,auVar84);
        auVar84 = ZEXT1632(auVar20);
        auVar195 = vfmadd213ps_fma(auVar83,auVar84,ZEXT1632(auVar19));
        auVar79 = vfnmadd213ps_fma(auVar93,auVar89,auVar85);
        auVar16 = vfmadd213ps_fma(auVar98,auVar84,auVar91);
        auVar94 = vfnmadd231ps_avx512vl(auVar95,auVar89,auVar96);
        auVar24 = vfnmadd213ps_fma(auVar92,auVar84,ZEXT1632(auVar18));
        auVar19 = vfnmadd213ps_fma(auVar83,auVar84,ZEXT1632(auVar19));
        auVar25 = vfnmadd231ps_fma(auVar91,ZEXT1632(auVar20),auVar98);
        auVar98 = vsubps_avx512vl(auVar82,ZEXT1632(auVar78));
        auVar96 = vsubps_avx(ZEXT1632(auVar195),ZEXT1632(auVar79));
        auVar93 = vsubps_avx512vl(ZEXT1632(auVar16),auVar94);
        auVar92 = vmulps_avx512vl(auVar96,auVar94);
        auVar17 = vfmsub231ps_fma(auVar92,ZEXT1632(auVar79),auVar93);
        auVar84._4_4_ = auVar78._4_4_ * auVar93._4_4_;
        auVar84._0_4_ = auVar78._0_4_ * auVar93._0_4_;
        auVar84._8_4_ = auVar78._8_4_ * auVar93._8_4_;
        auVar84._12_4_ = auVar78._12_4_ * auVar93._12_4_;
        auVar84._16_4_ = auVar93._16_4_ * 0.0;
        auVar84._20_4_ = auVar93._20_4_ * 0.0;
        auVar84._24_4_ = auVar93._24_4_ * 0.0;
        auVar84._28_4_ = auVar93._28_4_;
        auVar93 = vfmsub231ps_avx512vl(auVar84,auVar94,auVar98);
        auVar85._4_4_ = auVar79._4_4_ * auVar98._4_4_;
        auVar85._0_4_ = auVar79._0_4_ * auVar98._0_4_;
        auVar85._8_4_ = auVar79._8_4_ * auVar98._8_4_;
        auVar85._12_4_ = auVar79._12_4_ * auVar98._12_4_;
        auVar85._16_4_ = auVar98._16_4_ * 0.0;
        auVar85._20_4_ = auVar98._20_4_ * 0.0;
        auVar85._24_4_ = auVar98._24_4_ * 0.0;
        auVar85._28_4_ = auVar98._28_4_;
        auVar18 = vfmsub231ps_fma(auVar85,ZEXT1632(auVar78),auVar96);
        auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar18),auVar87,auVar93);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar87,ZEXT1632(auVar17));
        auVar97 = ZEXT1632(auVar80);
        uVar69 = vcmpps_avx512vl(auVar96,auVar97,2);
        bVar58 = (byte)uVar69;
        fVar70 = (float)((uint)(bVar58 & 1) * auVar75._0_4_ |
                        (uint)!(bool)(bVar58 & 1) * auVar24._0_4_);
        bVar10 = (bool)((byte)(uVar69 >> 1) & 1);
        fVar118 = (float)((uint)bVar10 * auVar75._4_4_ | (uint)!bVar10 * auVar24._4_4_);
        bVar10 = (bool)((byte)(uVar69 >> 2) & 1);
        fVar120 = (float)((uint)bVar10 * auVar75._8_4_ | (uint)!bVar10 * auVar24._8_4_);
        bVar10 = (bool)((byte)(uVar69 >> 3) & 1);
        fVar123 = (float)((uint)bVar10 * auVar75._12_4_ | (uint)!bVar10 * auVar24._12_4_);
        auVar92 = ZEXT1632(CONCAT412(fVar123,CONCAT48(fVar120,CONCAT44(fVar118,fVar70))));
        fVar71 = (float)((uint)(bVar58 & 1) * auVar77._0_4_ |
                        (uint)!(bool)(bVar58 & 1) * auVar19._0_4_);
        bVar10 = (bool)((byte)(uVar69 >> 1) & 1);
        fVar119 = (float)((uint)bVar10 * auVar77._4_4_ | (uint)!bVar10 * auVar19._4_4_);
        bVar10 = (bool)((byte)(uVar69 >> 2) & 1);
        fVar121 = (float)((uint)bVar10 * auVar77._8_4_ | (uint)!bVar10 * auVar19._8_4_);
        bVar10 = (bool)((byte)(uVar69 >> 3) & 1);
        fVar124 = (float)((uint)bVar10 * auVar77._12_4_ | (uint)!bVar10 * auVar19._12_4_);
        auVar83 = ZEXT1632(CONCAT412(fVar124,CONCAT48(fVar121,CONCAT44(fVar119,fVar71))));
        auVar95._0_4_ =
             (float)((uint)(bVar58 & 1) * auVar81._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar25._0_4_)
        ;
        bVar10 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar95._4_4_ = (float)((uint)bVar10 * auVar81._4_4_ | (uint)!bVar10 * auVar25._4_4_);
        bVar10 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar95._8_4_ = (float)((uint)bVar10 * auVar81._8_4_ | (uint)!bVar10 * auVar25._8_4_);
        bVar10 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar95._12_4_ = (float)((uint)bVar10 * auVar81._12_4_ | (uint)!bVar10 * auVar25._12_4_);
        fVar150 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar81._16_4_);
        auVar95._16_4_ = fVar150;
        fVar136 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar81._20_4_);
        auVar95._20_4_ = fVar136;
        fVar137 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar81._24_4_);
        auVar95._24_4_ = fVar137;
        iVar1 = (uint)(byte)(uVar69 >> 7) * auVar81._28_4_;
        auVar95._28_4_ = iVar1;
        auVar98 = vblendmps_avx512vl(ZEXT1632(auVar78),auVar82);
        auVar102._0_4_ =
             (uint)(bVar58 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar17._0_4_;
        bVar10 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar102._4_4_ = (uint)bVar10 * auVar98._4_4_ | (uint)!bVar10 * auVar17._4_4_;
        bVar10 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar102._8_4_ = (uint)bVar10 * auVar98._8_4_ | (uint)!bVar10 * auVar17._8_4_;
        bVar10 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar102._12_4_ = (uint)bVar10 * auVar98._12_4_ | (uint)!bVar10 * auVar17._12_4_;
        auVar102._16_4_ = (uint)((byte)(uVar69 >> 4) & 1) * auVar98._16_4_;
        auVar102._20_4_ = (uint)((byte)(uVar69 >> 5) & 1) * auVar98._20_4_;
        auVar102._24_4_ = (uint)((byte)(uVar69 >> 6) & 1) * auVar98._24_4_;
        auVar102._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar98._28_4_;
        auVar98 = vblendmps_avx512vl(ZEXT1632(auVar79),ZEXT1632(auVar195));
        auVar103._0_4_ =
             (float)((uint)(bVar58 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar77._0_4_)
        ;
        bVar10 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar103._4_4_ = (float)((uint)bVar10 * auVar98._4_4_ | (uint)!bVar10 * auVar77._4_4_);
        bVar10 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar103._8_4_ = (float)((uint)bVar10 * auVar98._8_4_ | (uint)!bVar10 * auVar77._8_4_);
        bVar10 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar103._12_4_ = (float)((uint)bVar10 * auVar98._12_4_ | (uint)!bVar10 * auVar77._12_4_);
        fVar138 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar98._16_4_);
        auVar103._16_4_ = fVar138;
        fVar168 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar98._20_4_);
        auVar103._20_4_ = fVar168;
        fVar171 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar98._24_4_);
        auVar103._24_4_ = fVar171;
        auVar103._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar98._28_4_;
        auVar98 = vblendmps_avx512vl(auVar94,ZEXT1632(auVar16));
        auVar104._0_4_ =
             (float)((uint)(bVar58 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar81._0_4_)
        ;
        bVar10 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar104._4_4_ = (float)((uint)bVar10 * auVar98._4_4_ | (uint)!bVar10 * auVar81._4_4_);
        bVar10 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar104._8_4_ = (float)((uint)bVar10 * auVar98._8_4_ | (uint)!bVar10 * auVar81._8_4_);
        bVar10 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar104._12_4_ = (float)((uint)bVar10 * auVar98._12_4_ | (uint)!bVar10 * auVar81._12_4_);
        bVar10 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar104._16_4_ = (float)((uint)bVar10 * auVar98._16_4_ | (uint)!bVar10 * auVar81._16_4_);
        bVar10 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar104._20_4_ = (float)((uint)bVar10 * auVar98._20_4_ | (uint)!bVar10 * auVar81._20_4_);
        bVar10 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar104._24_4_ = (float)((uint)bVar10 * auVar98._24_4_ | (uint)!bVar10 * auVar81._24_4_);
        bVar10 = SUB81(uVar69 >> 7,0);
        auVar104._28_4_ = (uint)bVar10 * auVar98._28_4_ | (uint)!bVar10 * auVar81._28_4_;
        auVar105._0_4_ =
             (uint)(bVar58 & 1) * (int)auVar78._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar82._0_4_;
        bVar10 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar105._4_4_ = (uint)bVar10 * (int)auVar78._4_4_ | (uint)!bVar10 * auVar82._4_4_;
        bVar10 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar105._8_4_ = (uint)bVar10 * (int)auVar78._8_4_ | (uint)!bVar10 * auVar82._8_4_;
        bVar10 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar105._12_4_ = (uint)bVar10 * (int)auVar78._12_4_ | (uint)!bVar10 * auVar82._12_4_;
        auVar105._16_4_ = (uint)!(bool)((byte)(uVar69 >> 4) & 1) * auVar82._16_4_;
        auVar105._20_4_ = (uint)!(bool)((byte)(uVar69 >> 5) & 1) * auVar82._20_4_;
        auVar105._24_4_ = (uint)!(bool)((byte)(uVar69 >> 6) & 1) * auVar82._24_4_;
        auVar105._28_4_ = (uint)!SUB81(uVar69 >> 7,0) * auVar82._28_4_;
        bVar10 = (bool)((byte)(uVar69 >> 1) & 1);
        bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
        bVar13 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar106._0_4_ =
             (uint)(bVar58 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar16._0_4_;
        bVar11 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar106._4_4_ = (uint)bVar11 * auVar94._4_4_ | (uint)!bVar11 * auVar16._4_4_;
        bVar11 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar106._8_4_ = (uint)bVar11 * auVar94._8_4_ | (uint)!bVar11 * auVar16._8_4_;
        bVar11 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar106._12_4_ = (uint)bVar11 * auVar94._12_4_ | (uint)!bVar11 * auVar16._12_4_;
        auVar106._16_4_ = (uint)((byte)(uVar69 >> 4) & 1) * auVar94._16_4_;
        auVar106._20_4_ = (uint)((byte)(uVar69 >> 5) & 1) * auVar94._20_4_;
        auVar106._24_4_ = (uint)((byte)(uVar69 >> 6) & 1) * auVar94._24_4_;
        iVar2 = (uint)(byte)(uVar69 >> 7) * auVar94._28_4_;
        auVar106._28_4_ = iVar2;
        auVar84 = vsubps_avx512vl(auVar105,auVar92);
        auVar98 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar13 * (int)auVar79._12_4_ |
                                                (uint)!bVar13 * auVar195._12_4_,
                                                CONCAT48((uint)bVar12 * (int)auVar79._8_4_ |
                                                         (uint)!bVar12 * auVar195._8_4_,
                                                         CONCAT44((uint)bVar10 * (int)auVar79._4_4_
                                                                  | (uint)!bVar10 * auVar195._4_4_,
                                                                  (uint)(bVar58 & 1) *
                                                                  (int)auVar79._0_4_ |
                                                                  (uint)!(bool)(bVar58 & 1) *
                                                                  auVar195._0_4_)))),auVar83);
        auVar94 = vsubps_avx(auVar106,auVar95);
        auVar93 = vsubps_avx(auVar92,auVar102);
        auVar81 = vsubps_avx(auVar83,auVar103);
        auVar82 = vsubps_avx(auVar95,auVar104);
        auVar87._4_4_ = auVar94._4_4_ * fVar118;
        auVar87._0_4_ = auVar94._0_4_ * fVar70;
        auVar87._8_4_ = auVar94._8_4_ * fVar120;
        auVar87._12_4_ = auVar94._12_4_ * fVar123;
        auVar87._16_4_ = auVar94._16_4_ * 0.0;
        auVar87._20_4_ = auVar94._20_4_ * 0.0;
        auVar87._24_4_ = auVar94._24_4_ * 0.0;
        auVar87._28_4_ = iVar2;
        auVar75 = vfmsub231ps_fma(auVar87,auVar95,auVar84);
        auVar88._4_4_ = fVar119 * auVar84._4_4_;
        auVar88._0_4_ = fVar71 * auVar84._0_4_;
        auVar88._8_4_ = fVar121 * auVar84._8_4_;
        auVar88._12_4_ = fVar124 * auVar84._12_4_;
        auVar88._16_4_ = auVar84._16_4_ * 0.0;
        auVar88._20_4_ = auVar84._20_4_ * 0.0;
        auVar88._24_4_ = auVar84._24_4_ * 0.0;
        auVar88._28_4_ = auVar96._28_4_;
        auVar77 = vfmsub231ps_fma(auVar88,auVar92,auVar98);
        auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar77),auVar97,ZEXT1632(auVar75));
        auVar161._0_4_ = auVar98._0_4_ * auVar95._0_4_;
        auVar161._4_4_ = auVar98._4_4_ * auVar95._4_4_;
        auVar161._8_4_ = auVar98._8_4_ * auVar95._8_4_;
        auVar161._12_4_ = auVar98._12_4_ * auVar95._12_4_;
        auVar161._16_4_ = auVar98._16_4_ * fVar150;
        auVar161._20_4_ = auVar98._20_4_ * fVar136;
        auVar161._24_4_ = auVar98._24_4_ * fVar137;
        auVar161._28_4_ = 0;
        auVar75 = vfmsub231ps_fma(auVar161,auVar83,auVar94);
        auVar85 = vfmadd231ps_avx512vl(auVar96,auVar97,ZEXT1632(auVar75));
        auVar96 = vmulps_avx512vl(auVar82,auVar102);
        auVar96 = vfmsub231ps_avx512vl(auVar96,auVar93,auVar104);
        auVar91._4_4_ = auVar81._4_4_ * auVar104._4_4_;
        auVar91._0_4_ = auVar81._0_4_ * auVar104._0_4_;
        auVar91._8_4_ = auVar81._8_4_ * auVar104._8_4_;
        auVar91._12_4_ = auVar81._12_4_ * auVar104._12_4_;
        auVar91._16_4_ = auVar81._16_4_ * auVar104._16_4_;
        auVar91._20_4_ = auVar81._20_4_ * auVar104._20_4_;
        auVar91._24_4_ = auVar81._24_4_ * auVar104._24_4_;
        auVar91._28_4_ = auVar104._28_4_;
        auVar75 = vfmsub231ps_fma(auVar91,auVar103,auVar82);
        auVar162._0_4_ = auVar103._0_4_ * auVar93._0_4_;
        auVar162._4_4_ = auVar103._4_4_ * auVar93._4_4_;
        auVar162._8_4_ = auVar103._8_4_ * auVar93._8_4_;
        auVar162._12_4_ = auVar103._12_4_ * auVar93._12_4_;
        auVar162._16_4_ = fVar138 * auVar93._16_4_;
        auVar162._20_4_ = fVar168 * auVar93._20_4_;
        auVar162._24_4_ = fVar171 * auVar93._24_4_;
        auVar162._28_4_ = 0;
        auVar77 = vfmsub231ps_fma(auVar162,auVar81,auVar102);
        auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar77),auVar97,auVar96);
        auVar87 = vfmadd231ps_avx512vl(auVar96,auVar97,ZEXT1632(auVar75));
        auVar96 = vmaxps_avx(auVar85,auVar87);
        uVar139 = vcmpps_avx512vl(auVar96,auVar97,2);
        bVar67 = bVar67 & (byte)uVar139;
        auVar193 = ZEXT3264(local_400);
        auVar194 = ZEXT3264(local_420);
        auVar185 = ZEXT1664(auVar76);
        if (bVar67 == 0) {
          uVar61 = 0;
          auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar192 = ZEXT3264(auVar96);
          auVar201 = ZEXT3264(local_4a0);
          auVar197 = ZEXT3264(local_4c0);
          auVar198 = ZEXT3264(local_4e0);
          auVar199 = ZEXT3264(local_500);
        }
        else {
          auVar88 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x80)));
          auVar190 = ZEXT3264(auVar88);
          auVar33._4_4_ = auVar82._4_4_ * auVar98._4_4_;
          auVar33._0_4_ = auVar82._0_4_ * auVar98._0_4_;
          auVar33._8_4_ = auVar82._8_4_ * auVar98._8_4_;
          auVar33._12_4_ = auVar82._12_4_ * auVar98._12_4_;
          auVar33._16_4_ = auVar82._16_4_ * auVar98._16_4_;
          auVar33._20_4_ = auVar82._20_4_ * auVar98._20_4_;
          auVar33._24_4_ = auVar82._24_4_ * auVar98._24_4_;
          auVar33._28_4_ = auVar96._28_4_;
          auVar195 = vfmsub231ps_fma(auVar33,auVar81,auVar94);
          auVar34._4_4_ = auVar94._4_4_ * auVar93._4_4_;
          auVar34._0_4_ = auVar94._0_4_ * auVar93._0_4_;
          auVar34._8_4_ = auVar94._8_4_ * auVar93._8_4_;
          auVar34._12_4_ = auVar94._12_4_ * auVar93._12_4_;
          auVar34._16_4_ = auVar94._16_4_ * auVar93._16_4_;
          auVar34._20_4_ = auVar94._20_4_ * auVar93._20_4_;
          auVar34._24_4_ = auVar94._24_4_ * auVar93._24_4_;
          auVar34._28_4_ = auVar94._28_4_;
          auVar77 = vfmsub231ps_fma(auVar34,auVar84,auVar82);
          auVar35._4_4_ = auVar81._4_4_ * auVar84._4_4_;
          auVar35._0_4_ = auVar81._0_4_ * auVar84._0_4_;
          auVar35._8_4_ = auVar81._8_4_ * auVar84._8_4_;
          auVar35._12_4_ = auVar81._12_4_ * auVar84._12_4_;
          auVar35._16_4_ = auVar81._16_4_ * auVar84._16_4_;
          auVar35._20_4_ = auVar81._20_4_ * auVar84._20_4_;
          auVar35._24_4_ = auVar81._24_4_ * auVar84._24_4_;
          auVar35._28_4_ = auVar81._28_4_;
          auVar16 = vfmsub231ps_fma(auVar35,auVar93,auVar98);
          auVar75 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar77),ZEXT1632(auVar16));
          auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar75),ZEXT1632(auVar195),auVar97);
          auVar98 = vrcp14ps_avx512vl(auVar96);
          auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar192 = ZEXT3264(auVar94);
          auVar93 = vfnmadd213ps_avx512vl(auVar98,auVar96,auVar94);
          auVar75 = vfmadd132ps_fma(auVar93,auVar98,auVar98);
          auVar36._4_4_ = auVar16._4_4_ * auVar95._4_4_;
          auVar36._0_4_ = auVar16._0_4_ * auVar95._0_4_;
          auVar36._8_4_ = auVar16._8_4_ * auVar95._8_4_;
          auVar36._12_4_ = auVar16._12_4_ * auVar95._12_4_;
          auVar36._16_4_ = fVar150 * 0.0;
          auVar36._20_4_ = fVar136 * 0.0;
          auVar36._24_4_ = fVar137 * 0.0;
          auVar36._28_4_ = iVar1;
          auVar77 = vfmadd231ps_fma(auVar36,auVar83,ZEXT1632(auVar77));
          auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar92,ZEXT1632(auVar195));
          fVar150 = auVar75._0_4_;
          fVar136 = auVar75._4_4_;
          fVar137 = auVar75._8_4_;
          fVar138 = auVar75._12_4_;
          local_240 = ZEXT1632(CONCAT412(auVar77._12_4_ * fVar138,
                                         CONCAT48(auVar77._8_4_ * fVar137,
                                                  CONCAT44(auVar77._4_4_ * fVar136,
                                                           auVar77._0_4_ * fVar150))));
          auVar174._4_4_ = uVar64;
          auVar174._0_4_ = uVar64;
          auVar174._8_4_ = uVar64;
          auVar174._12_4_ = uVar64;
          auVar174._16_4_ = uVar64;
          auVar174._20_4_ = uVar64;
          auVar174._24_4_ = uVar64;
          auVar174._28_4_ = uVar64;
          uVar139 = vcmpps_avx512vl(local_240,auVar88,2);
          uVar21 = vcmpps_avx512vl(auVar174,local_240,2);
          bVar67 = (byte)uVar139 & (byte)uVar21 & bVar67;
          auVar201 = ZEXT3264(local_4a0);
          auVar197 = ZEXT3264(local_4c0);
          auVar198 = ZEXT3264(local_4e0);
          auVar199 = ZEXT3264(local_500);
          auVar189 = ZEXT3264(auVar86);
          if (bVar67 != 0) {
            uVar139 = vcmpps_avx512vl(auVar96,auVar97,4);
            bVar67 = bVar67 & (byte)uVar139;
            if (bVar67 != 0) {
              fVar168 = auVar85._0_4_ * fVar150;
              fVar171 = auVar85._4_4_ * fVar136;
              auVar37._4_4_ = fVar171;
              auVar37._0_4_ = fVar168;
              fVar70 = auVar85._8_4_ * fVar137;
              auVar37._8_4_ = fVar70;
              fVar71 = auVar85._12_4_ * fVar138;
              auVar37._12_4_ = fVar71;
              fVar118 = auVar85._16_4_ * 0.0;
              auVar37._16_4_ = fVar118;
              fVar119 = auVar85._20_4_ * 0.0;
              auVar37._20_4_ = fVar119;
              fVar120 = auVar85._24_4_ * 0.0;
              auVar37._24_4_ = fVar120;
              auVar37._28_4_ = auVar96._28_4_;
              auVar98 = vsubps_avx512vl(auVar94,auVar37);
              local_280._0_4_ =
                   (float)((uint)(bVar58 & 1) * (int)fVar168 |
                          (uint)!(bool)(bVar58 & 1) * auVar98._0_4_);
              bVar10 = (bool)((byte)(uVar69 >> 1) & 1);
              local_280._4_4_ = (float)((uint)bVar10 * (int)fVar171 | (uint)!bVar10 * auVar98._4_4_)
              ;
              bVar10 = (bool)((byte)(uVar69 >> 2) & 1);
              local_280._8_4_ = (float)((uint)bVar10 * (int)fVar70 | (uint)!bVar10 * auVar98._8_4_);
              bVar10 = (bool)((byte)(uVar69 >> 3) & 1);
              local_280._12_4_ =
                   (float)((uint)bVar10 * (int)fVar71 | (uint)!bVar10 * auVar98._12_4_);
              bVar10 = (bool)((byte)(uVar69 >> 4) & 1);
              local_280._16_4_ =
                   (float)((uint)bVar10 * (int)fVar118 | (uint)!bVar10 * auVar98._16_4_);
              bVar10 = (bool)((byte)(uVar69 >> 5) & 1);
              local_280._20_4_ =
                   (float)((uint)bVar10 * (int)fVar119 | (uint)!bVar10 * auVar98._20_4_);
              bVar10 = (bool)((byte)(uVar69 >> 6) & 1);
              local_280._24_4_ =
                   (float)((uint)bVar10 * (int)fVar120 | (uint)!bVar10 * auVar98._24_4_);
              bVar10 = SUB81(uVar69 >> 7,0);
              local_280._28_4_ =
                   (float)((uint)bVar10 * auVar96._28_4_ | (uint)!bVar10 * auVar98._28_4_);
              auVar96 = vsubps_avx(ZEXT1632(auVar20),auVar89);
              auVar75 = vfmadd213ps_fma(auVar96,local_280,auVar89);
              uVar127 = *(undefined4 *)((long)local_5d8->ray_space + k * 4 + -0x10);
              auVar89._4_4_ = uVar127;
              auVar89._0_4_ = uVar127;
              auVar89._8_4_ = uVar127;
              auVar89._12_4_ = uVar127;
              auVar89._16_4_ = uVar127;
              auVar89._20_4_ = uVar127;
              auVar89._24_4_ = uVar127;
              auVar89._28_4_ = uVar127;
              auVar96 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar75._12_4_ + auVar75._12_4_,
                                                           CONCAT48(auVar75._8_4_ + auVar75._8_4_,
                                                                    CONCAT44(auVar75._4_4_ +
                                                                             auVar75._4_4_,
                                                                             auVar75._0_4_ +
                                                                             auVar75._0_4_)))),
                                        auVar89);
              uVar139 = vcmpps_avx512vl(local_240,auVar96,6);
              if (((byte)uVar139 & bVar67) != 0) {
                auVar153._0_4_ = auVar87._0_4_ * fVar150;
                auVar153._4_4_ = auVar87._4_4_ * fVar136;
                auVar153._8_4_ = auVar87._8_4_ * fVar137;
                auVar153._12_4_ = auVar87._12_4_ * fVar138;
                auVar153._16_4_ = auVar87._16_4_ * 0.0;
                auVar153._20_4_ = auVar87._20_4_ * 0.0;
                auVar153._24_4_ = auVar87._24_4_ * 0.0;
                auVar153._28_4_ = 0;
                auVar96 = vsubps_avx512vl(auVar94,auVar153);
                auVar107._0_4_ =
                     (uint)(bVar58 & 1) * (int)auVar153._0_4_ |
                     (uint)!(bool)(bVar58 & 1) * auVar96._0_4_;
                bVar10 = (bool)((byte)(uVar69 >> 1) & 1);
                auVar107._4_4_ = (uint)bVar10 * (int)auVar153._4_4_ | (uint)!bVar10 * auVar96._4_4_;
                bVar10 = (bool)((byte)(uVar69 >> 2) & 1);
                auVar107._8_4_ = (uint)bVar10 * (int)auVar153._8_4_ | (uint)!bVar10 * auVar96._8_4_;
                bVar10 = (bool)((byte)(uVar69 >> 3) & 1);
                auVar107._12_4_ =
                     (uint)bVar10 * (int)auVar153._12_4_ | (uint)!bVar10 * auVar96._12_4_;
                bVar10 = (bool)((byte)(uVar69 >> 4) & 1);
                auVar107._16_4_ =
                     (uint)bVar10 * (int)auVar153._16_4_ | (uint)!bVar10 * auVar96._16_4_;
                bVar10 = (bool)((byte)(uVar69 >> 5) & 1);
                auVar107._20_4_ =
                     (uint)bVar10 * (int)auVar153._20_4_ | (uint)!bVar10 * auVar96._20_4_;
                bVar10 = (bool)((byte)(uVar69 >> 6) & 1);
                auVar107._24_4_ =
                     (uint)bVar10 * (int)auVar153._24_4_ | (uint)!bVar10 * auVar96._24_4_;
                auVar107._28_4_ = (uint)!SUB81(uVar69 >> 7,0) * auVar96._28_4_;
                auVar30._8_4_ = 0x40000000;
                auVar30._0_8_ = 0x4000000040000000;
                auVar30._12_4_ = 0x40000000;
                auVar30._16_4_ = 0x40000000;
                auVar30._20_4_ = 0x40000000;
                auVar30._24_4_ = 0x40000000;
                auVar30._28_4_ = 0x40000000;
                local_260 = vfmsub132ps_avx512vl(auVar107,auVar94,auVar30);
                local_220 = 0;
                local_210 = local_510._0_8_;
                uStack_208 = local_510._8_8_;
                local_200 = local_520._0_8_;
                uStack_1f8 = local_520._8_8_;
                local_1f0 = local_530._0_8_;
                uStack_1e8 = local_530._8_8_;
                if ((pGVar63->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (uVar61 = CONCAT71((int7)(uVar61 >> 8),1),
                     pGVar63->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar150 = 1.0 / auVar90._0_4_;
                    local_1c0[0] = fVar150 * (local_280._0_4_ + 0.0);
                    local_1c0[1] = fVar150 * (local_280._4_4_ + 1.0);
                    local_1c0[2] = fVar150 * (local_280._8_4_ + 2.0);
                    local_1c0[3] = fVar150 * (local_280._12_4_ + 3.0);
                    fStack_1b0 = fVar150 * (local_280._16_4_ + 4.0);
                    fStack_1ac = fVar150 * (local_280._20_4_ + 5.0);
                    fStack_1a8 = fVar150 * (local_280._24_4_ + 6.0);
                    fStack_1a4 = local_280._28_4_ + 7.0;
                    local_1a0 = local_260;
                    local_180 = local_240;
                    uVar69 = 0;
                    uVar62 = (ulong)((byte)uVar139 & bVar67);
                    for (uVar68 = uVar62; (uVar68 & 1) == 0;
                        uVar68 = uVar68 >> 1 | 0x8000000000000000) {
                      uVar69 = uVar69 + 1;
                    }
                    _local_2c0 = vpbroadcastd_avx512vl();
                    local_480 = vpbroadcastd_avx512vl();
                    local_5f0 = auVar76;
                    local_440 = auVar86;
                    local_3e0 = auVar88;
                    local_21c = iVar7;
                    do {
                      auVar195 = auVar196._0_16_;
                      fVar150 = local_1c0[uVar69];
                      local_320._4_4_ = fVar150;
                      local_320._0_4_ = fVar150;
                      local_320._8_4_ = fVar150;
                      local_320._12_4_ = fVar150;
                      local_310 = *(undefined4 *)(local_1a0 + uVar69 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_180 + uVar69 * 4);
                      local_5d0.context = context->user;
                      fVar136 = 1.0 - fVar150;
                      auVar27._8_4_ = 0x80000000;
                      auVar27._0_8_ = 0x8000000080000000;
                      auVar27._12_4_ = 0x80000000;
                      auVar77 = vxorps_avx512vl(ZEXT416((uint)fVar136),auVar27);
                      auVar76 = ZEXT416((uint)(fVar150 * fVar136 * 4.0));
                      auVar75 = vfnmsub213ss_fma(local_320,local_320,auVar76);
                      auVar76 = vfmadd213ss_fma(ZEXT416((uint)fVar136),ZEXT416((uint)fVar136),
                                                auVar76);
                      fVar136 = fVar136 * auVar77._0_4_ * 0.5;
                      fVar137 = auVar75._0_4_ * 0.5;
                      fVar138 = auVar76._0_4_ * 0.5;
                      fVar150 = fVar150 * fVar150 * 0.5;
                      auVar157._0_4_ = fVar150 * (float)local_3b0._0_4_;
                      auVar157._4_4_ = fVar150 * (float)local_3b0._4_4_;
                      auVar157._8_4_ = fVar150 * fStack_3a8;
                      auVar157._12_4_ = fVar150 * fStack_3a4;
                      auVar132._4_4_ = fVar138;
                      auVar132._0_4_ = fVar138;
                      auVar132._8_4_ = fVar138;
                      auVar132._12_4_ = fVar138;
                      auVar76 = vfmadd132ps_fma(auVar132,auVar157,local_530);
                      auVar158._4_4_ = fVar137;
                      auVar158._0_4_ = fVar137;
                      auVar158._8_4_ = fVar137;
                      auVar158._12_4_ = fVar137;
                      auVar76 = vfmadd132ps_fma(auVar158,auVar76,local_520);
                      auVar133._4_4_ = fVar136;
                      auVar133._0_4_ = fVar136;
                      auVar133._8_4_ = fVar136;
                      auVar133._12_4_ = fVar136;
                      auVar76 = vfmadd132ps_fma(auVar133,auVar76,local_510);
                      local_350 = auVar76._0_4_;
                      local_340 = vshufps_avx(auVar76,auVar76,0x55);
                      local_330 = vshufps_avx(auVar76,auVar76,0xaa);
                      local_300 = local_480._0_8_;
                      uStack_2f8 = local_480._8_8_;
                      local_2f0 = _local_2c0;
                      vpcmpeqd_avx2(ZEXT1632(_local_2c0),ZEXT1632(_local_2c0));
                      uStack_2dc = (local_5d0.context)->instID[0];
                      local_2e0 = uStack_2dc;
                      uStack_2d8 = uStack_2dc;
                      uStack_2d4 = uStack_2dc;
                      uStack_2d0 = (local_5d0.context)->instPrimID[0];
                      uStack_2cc = uStack_2d0;
                      uStack_2c8 = uStack_2d0;
                      uStack_2c4 = uStack_2d0;
                      local_610 = local_3c0;
                      local_5d0.valid = (int *)local_610;
                      local_5d0.geometryUserPtr = pGVar63->userPtr;
                      local_5d0.hit = (RTCHitN *)&local_350;
                      local_5d0.N = 4;
                      local_380 = (float)uVar62;
                      fStack_37c = (float)(uVar62 >> 0x20);
                      local_3a0 = (uint)uVar69;
                      uStack_39c = (uint)(uVar69 >> 0x20);
                      local_5d0.ray = (RTCRayN *)ray;
                      uStack_34c = local_350;
                      uStack_348 = local_350;
                      uStack_344 = local_350;
                      uStack_30c = local_310;
                      uStack_308 = local_310;
                      uStack_304 = local_310;
                      if (pGVar63->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar63->occlusionFilterN)(&local_5d0);
                        uVar69 = CONCAT44(uStack_39c,local_3a0);
                        uVar62 = CONCAT44(fStack_37c,local_380);
                        auVar190 = ZEXT3264(local_3e0);
                        auVar185 = ZEXT1664(local_5f0);
                        auVar189 = ZEXT3264(local_440);
                        auVar199 = ZEXT3264(local_500);
                        auVar198 = ZEXT3264(local_4e0);
                        auVar197 = ZEXT3264(local_4c0);
                        auVar201 = ZEXT3264(local_4a0);
                        auVar191 = ZEXT3264(local_5a0);
                        auVar200 = ZEXT3264(local_580);
                        auVar194 = ZEXT3264(local_420);
                        auVar193 = ZEXT3264(local_400);
                        auVar76 = vxorps_avx512vl(auVar195,auVar195);
                        auVar196 = ZEXT1664(auVar76);
                        uVar64 = local_460._0_4_;
                      }
                      auVar76 = auVar196._0_16_;
                      uVar68 = vptestmd_avx512vl(local_610,local_610);
                      if ((uVar68 & 0xf) == 0) {
                        auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar192 = ZEXT3264(auVar96);
                      }
                      else {
                        p_Var9 = context->args->filter;
                        if (p_Var9 == (RTCFilterFunctionN)0x0) {
                          auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar192 = ZEXT3264(auVar96);
                        }
                        else {
                          auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar192 = ZEXT3264(auVar96);
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar63->field_8).field_0x2 & 0x40) != 0)) {
                            (*p_Var9)(&local_5d0);
                            uVar69 = CONCAT44(uStack_39c,local_3a0);
                            uVar62 = CONCAT44(fStack_37c,local_380);
                            auVar190 = ZEXT3264(local_3e0);
                            auVar185 = ZEXT1664(local_5f0);
                            auVar189 = ZEXT3264(local_440);
                            auVar199 = ZEXT3264(local_500);
                            auVar198 = ZEXT3264(local_4e0);
                            auVar197 = ZEXT3264(local_4c0);
                            auVar201 = ZEXT3264(local_4a0);
                            auVar191 = ZEXT3264(local_5a0);
                            auVar200 = ZEXT3264(local_580);
                            auVar194 = ZEXT3264(local_420);
                            auVar193 = ZEXT3264(local_400);
                            auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar192 = ZEXT3264(auVar96);
                            auVar76 = vxorps_avx512vl(auVar76,auVar76);
                            auVar196 = ZEXT1664(auVar76);
                            uVar64 = local_460._0_4_;
                          }
                        }
                        local_380 = auVar185._0_4_;
                        auVar86 = auVar189._0_32_;
                        uVar68 = vptestmd_avx512vl(local_610,local_610);
                        uVar68 = uVar68 & 0xf;
                        auVar76 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar10 = (bool)((byte)uVar68 & 1);
                        bVar11 = (bool)((byte)(uVar68 >> 1) & 1);
                        bVar12 = (bool)((byte)(uVar68 >> 2) & 1);
                        bVar13 = SUB81(uVar68 >> 3,0);
                        *(uint *)(local_5d0.ray + 0x80) =
                             (uint)bVar10 * auVar76._0_4_ |
                             (uint)!bVar10 * *(int *)(local_5d0.ray + 0x80);
                        *(uint *)(local_5d0.ray + 0x84) =
                             (uint)bVar11 * auVar76._4_4_ |
                             (uint)!bVar11 * *(int *)(local_5d0.ray + 0x84);
                        *(uint *)(local_5d0.ray + 0x88) =
                             (uint)bVar12 * auVar76._8_4_ |
                             (uint)!bVar12 * *(int *)(local_5d0.ray + 0x88);
                        *(uint *)(local_5d0.ray + 0x8c) =
                             (uint)bVar13 * auVar76._12_4_ |
                             (uint)!bVar13 * *(int *)(local_5d0.ray + 0x8c);
                        if ((byte)uVar68 != 0) {
                          uVar61 = CONCAT71((int7)(uVar61 >> 8),1);
                          break;
                        }
                      }
                      local_380 = auVar185._0_4_;
                      auVar86 = auVar189._0_32_;
                      *(int *)(ray + k * 4 + 0x80) = auVar190._0_4_;
                      uVar68 = uVar69 & 0x3f;
                      uVar61 = 0;
                      uVar69 = 0;
                      uVar62 = uVar62 ^ 1L << uVar68;
                      for (uVar68 = uVar62; (uVar68 & 1) == 0;
                          uVar68 = uVar68 >> 1 | 0x8000000000000000) {
                        uVar69 = uVar69 + 1;
                      }
                    } while (uVar62 != 0);
                  }
                  goto LAB_01bb6a31;
                }
              }
            }
          }
          uVar61 = 0;
        }
      }
LAB_01bb6a31:
      if (8 < iVar7) {
        local_460 = vpbroadcastd_avx512vl();
        fStack_2b0 = 1.0 / (float)local_550._0_4_;
        local_2c0._4_4_ = fStack_2b0;
        local_2c0._0_4_ = fStack_2b0;
        fStack_2b8 = fStack_2b0;
        fStack_2b4 = fStack_2b0;
        local_550 = vpbroadcastd_avx512vl();
        local_540 = vpbroadcastd_avx512vl();
        lVar65 = 8;
        local_440 = auVar86;
        local_3a0 = uVar64;
        uStack_39c = uVar64;
        uStack_398 = uVar64;
        uStack_394 = uVar64;
        uStack_390 = uVar64;
        uStack_38c = uVar64;
        uStack_388 = uVar64;
        uStack_384 = uVar64;
        fStack_37c = local_380;
        fStack_378 = local_380;
        fStack_374 = local_380;
        fStack_370 = local_380;
        fStack_36c = local_380;
        fStack_368 = local_380;
        fStack_364 = local_380;
        fStack_2ac = fStack_2b0;
        fStack_2a8 = fStack_2b0;
        fStack_2a4 = fStack_2b0;
        do {
          auVar96 = vpbroadcastd_avx512vl();
          auVar81 = vpor_avx2(auVar96,_DAT_01fe9900);
          uVar21 = vpcmpd_avx512vl(auVar81,local_460,1);
          auVar96 = *(undefined1 (*) [32])(bspline_basis0 + lVar65 * 4 + lVar22);
          auVar98 = *(undefined1 (*) [32])(lVar22 + 0x21aefac + lVar65 * 4);
          auVar94 = *(undefined1 (*) [32])(lVar22 + 0x21af430 + lVar65 * 4);
          auVar93 = *(undefined1 (*) [32])(lVar22 + 0x21af8b4 + lVar65 * 4);
          local_4e0 = auVar198._0_32_;
          auVar82 = vmulps_avx512vl(local_4e0,auVar93);
          local_500 = auVar199._0_32_;
          auVar92 = vmulps_avx512vl(local_500,auVar93);
          auVar38._4_4_ = auVar93._4_4_ * (float)local_e0._4_4_;
          auVar38._0_4_ = auVar93._0_4_ * (float)local_e0._0_4_;
          auVar38._8_4_ = auVar93._8_4_ * fStack_d8;
          auVar38._12_4_ = auVar93._12_4_ * fStack_d4;
          auVar38._16_4_ = auVar93._16_4_ * fStack_d0;
          auVar38._20_4_ = auVar93._20_4_ * fStack_cc;
          auVar38._24_4_ = auVar93._24_4_ * fStack_c8;
          auVar38._28_4_ = auVar81._28_4_;
          local_4a0 = auVar201._0_32_;
          auVar81 = vfmadd231ps_avx512vl(auVar82,auVar94,local_4a0);
          local_4c0 = auVar197._0_32_;
          auVar82 = vfmadd231ps_avx512vl(auVar92,auVar94,local_4c0);
          auVar92 = vfmadd231ps_avx512vl(auVar38,auVar94,local_c0);
          auVar101 = auVar200._0_32_;
          auVar81 = vfmadd231ps_avx512vl(auVar81,auVar98,auVar101);
          auVar97 = auVar191._0_32_;
          auVar82 = vfmadd231ps_avx512vl(auVar82,auVar98,auVar97);
          auVar76 = vfmadd231ps_fma(auVar92,auVar98,local_a0);
          auVar99 = auVar193._0_32_;
          auVar85 = vfmadd231ps_avx512vl(auVar81,auVar96,auVar99);
          auVar100 = auVar194._0_32_;
          auVar87 = vfmadd231ps_avx512vl(auVar82,auVar96,auVar100);
          auVar81 = *(undefined1 (*) [32])(bspline_basis1 + lVar65 * 4 + lVar22);
          auVar82 = *(undefined1 (*) [32])(lVar22 + 0x21b13cc + lVar65 * 4);
          auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar96,local_80);
          auVar92 = *(undefined1 (*) [32])(lVar22 + 0x21b1850 + lVar65 * 4);
          auVar83 = *(undefined1 (*) [32])(lVar22 + 0x21b1cd4 + lVar65 * 4);
          auVar86 = vmulps_avx512vl(local_4e0,auVar83);
          auVar84 = vmulps_avx512vl(local_500,auVar83);
          auVar39._4_4_ = auVar83._4_4_ * (float)local_e0._4_4_;
          auVar39._0_4_ = auVar83._0_4_ * (float)local_e0._0_4_;
          auVar39._8_4_ = auVar83._8_4_ * fStack_d8;
          auVar39._12_4_ = auVar83._12_4_ * fStack_d4;
          auVar39._16_4_ = auVar83._16_4_ * fStack_d0;
          auVar39._20_4_ = auVar83._20_4_ * fStack_cc;
          auVar39._24_4_ = auVar83._24_4_ * fStack_c8;
          auVar39._28_4_ = uStack_c4;
          auVar86 = vfmadd231ps_avx512vl(auVar86,auVar92,local_4a0);
          auVar84 = vfmadd231ps_avx512vl(auVar84,auVar92,local_4c0);
          auVar88 = vfmadd231ps_avx512vl(auVar39,auVar92,local_c0);
          auVar86 = vfmadd231ps_avx512vl(auVar86,auVar82,auVar101);
          auVar84 = vfmadd231ps_avx512vl(auVar84,auVar82,auVar97);
          auVar75 = vfmadd231ps_fma(auVar88,auVar82,local_a0);
          auVar88 = vfmadd231ps_avx512vl(auVar86,auVar81,auVar99);
          auVar89 = vfmadd231ps_avx512vl(auVar84,auVar81,auVar100);
          auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar81,local_80);
          auVar90 = vmaxps_avx512vl(ZEXT1632(auVar76),ZEXT1632(auVar75));
          auVar86 = vsubps_avx(auVar88,auVar85);
          auVar84 = vsubps_avx(auVar89,auVar87);
          auVar91 = vmulps_avx512vl(auVar87,auVar86);
          auVar95 = vmulps_avx512vl(auVar85,auVar84);
          auVar91 = vsubps_avx512vl(auVar91,auVar95);
          auVar95 = vmulps_avx512vl(auVar84,auVar84);
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar86,auVar86);
          auVar90 = vmulps_avx512vl(auVar90,auVar90);
          auVar90 = vmulps_avx512vl(auVar90,auVar95);
          auVar91 = vmulps_avx512vl(auVar91,auVar91);
          uVar139 = vcmpps_avx512vl(auVar91,auVar90,2);
          bVar67 = (byte)uVar21 & (byte)uVar139;
          if (bVar67 == 0) {
            auVar200 = ZEXT3264(auVar101);
          }
          else {
            auVar83 = vmulps_avx512vl(local_440,auVar83);
            auVar92 = vfmadd213ps_avx512vl(auVar92,local_140,auVar83);
            auVar82 = vfmadd213ps_avx512vl(auVar82,local_120,auVar92);
            auVar81 = vfmadd213ps_avx512vl(auVar81,local_100,auVar82);
            auVar93 = vmulps_avx512vl(local_440,auVar93);
            auVar94 = vfmadd213ps_avx512vl(auVar94,local_140,auVar93);
            auVar98 = vfmadd213ps_avx512vl(auVar98,local_120,auVar94);
            auVar82 = vfmadd213ps_avx512vl(auVar96,local_100,auVar98);
            auVar96 = *(undefined1 (*) [32])(lVar22 + 0x21afd38 + lVar65 * 4);
            auVar98 = *(undefined1 (*) [32])(lVar22 + 0x21b01bc + lVar65 * 4);
            auVar94 = *(undefined1 (*) [32])(lVar22 + 0x21b0640 + lVar65 * 4);
            auVar93 = *(undefined1 (*) [32])(lVar22 + 0x21b0ac4 + lVar65 * 4);
            auVar92 = vmulps_avx512vl(local_4e0,auVar93);
            auVar83 = vmulps_avx512vl(local_500,auVar93);
            auVar93 = vmulps_avx512vl(local_440,auVar93);
            auVar92 = vfmadd231ps_avx512vl(auVar92,auVar94,local_4a0);
            auVar83 = vfmadd231ps_avx512vl(auVar83,auVar94,local_4c0);
            auVar94 = vfmadd231ps_avx512vl(auVar93,local_140,auVar94);
            auVar93 = vfmadd231ps_avx512vl(auVar92,auVar98,auVar101);
            auVar92 = vfmadd231ps_avx512vl(auVar83,auVar98,auVar97);
            auVar98 = vfmadd231ps_avx512vl(auVar94,local_120,auVar98);
            auVar93 = vfmadd231ps_avx512vl(auVar93,auVar96,auVar99);
            auVar92 = vfmadd231ps_avx512vl(auVar92,auVar96,auVar100);
            auVar83 = vfmadd231ps_avx512vl(auVar98,local_100,auVar96);
            auVar96 = *(undefined1 (*) [32])(lVar22 + 0x21b2158 + lVar65 * 4);
            auVar98 = *(undefined1 (*) [32])(lVar22 + 0x21b2a60 + lVar65 * 4);
            auVar94 = *(undefined1 (*) [32])(lVar22 + 0x21b2ee4 + lVar65 * 4);
            auVar90 = vmulps_avx512vl(local_4e0,auVar94);
            auVar91 = vmulps_avx512vl(local_500,auVar94);
            auVar94 = vmulps_avx512vl(local_440,auVar94);
            auVar90 = vfmadd231ps_avx512vl(auVar90,auVar98,local_4a0);
            auVar91 = vfmadd231ps_avx512vl(auVar91,auVar98,local_4c0);
            auVar94 = vfmadd231ps_avx512vl(auVar94,local_140,auVar98);
            auVar98 = *(undefined1 (*) [32])(lVar22 + 0x21b25dc + lVar65 * 4);
            auVar90 = vfmadd231ps_avx512vl(auVar90,auVar98,auVar101);
            auVar91 = vfmadd231ps_avx512vl(auVar91,auVar98,auVar97);
            auVar98 = vfmadd231ps_avx512vl(auVar94,local_120,auVar98);
            auVar94 = vfmadd231ps_avx512vl(auVar90,auVar96,auVar99);
            auVar90 = vfmadd231ps_avx512vl(auVar91,auVar96,auVar100);
            auVar98 = vfmadd231ps_avx512vl(auVar98,local_100,auVar96);
            auVar91 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar93,auVar91);
            vandps_avx512vl(auVar92,auVar91);
            auVar96 = vmaxps_avx(auVar91,auVar91);
            vandps_avx512vl(auVar83,auVar91);
            auVar96 = vmaxps_avx(auVar96,auVar91);
            auVar57._4_4_ = fStack_37c;
            auVar57._0_4_ = local_380;
            auVar57._8_4_ = fStack_378;
            auVar57._12_4_ = fStack_374;
            auVar57._16_4_ = fStack_370;
            auVar57._20_4_ = fStack_36c;
            auVar57._24_4_ = fStack_368;
            auVar57._28_4_ = fStack_364;
            uVar69 = vcmpps_avx512vl(auVar96,auVar57,1);
            bVar10 = (bool)((byte)uVar69 & 1);
            auVar108._0_4_ = (float)((uint)bVar10 * auVar86._0_4_ | (uint)!bVar10 * auVar93._0_4_);
            bVar10 = (bool)((byte)(uVar69 >> 1) & 1);
            auVar108._4_4_ = (float)((uint)bVar10 * auVar86._4_4_ | (uint)!bVar10 * auVar93._4_4_);
            bVar10 = (bool)((byte)(uVar69 >> 2) & 1);
            auVar108._8_4_ = (float)((uint)bVar10 * auVar86._8_4_ | (uint)!bVar10 * auVar93._8_4_);
            bVar10 = (bool)((byte)(uVar69 >> 3) & 1);
            auVar108._12_4_ =
                 (float)((uint)bVar10 * auVar86._12_4_ | (uint)!bVar10 * auVar93._12_4_);
            bVar10 = (bool)((byte)(uVar69 >> 4) & 1);
            auVar108._16_4_ =
                 (float)((uint)bVar10 * auVar86._16_4_ | (uint)!bVar10 * auVar93._16_4_);
            bVar10 = (bool)((byte)(uVar69 >> 5) & 1);
            auVar108._20_4_ =
                 (float)((uint)bVar10 * auVar86._20_4_ | (uint)!bVar10 * auVar93._20_4_);
            bVar10 = (bool)((byte)(uVar69 >> 6) & 1);
            auVar108._24_4_ =
                 (float)((uint)bVar10 * auVar86._24_4_ | (uint)!bVar10 * auVar93._24_4_);
            bVar10 = SUB81(uVar69 >> 7,0);
            auVar108._28_4_ = (uint)bVar10 * auVar86._28_4_ | (uint)!bVar10 * auVar93._28_4_;
            bVar10 = (bool)((byte)uVar69 & 1);
            auVar109._0_4_ = (float)((uint)bVar10 * auVar84._0_4_ | (uint)!bVar10 * auVar92._0_4_);
            bVar10 = (bool)((byte)(uVar69 >> 1) & 1);
            auVar109._4_4_ = (float)((uint)bVar10 * auVar84._4_4_ | (uint)!bVar10 * auVar92._4_4_);
            bVar10 = (bool)((byte)(uVar69 >> 2) & 1);
            auVar109._8_4_ = (float)((uint)bVar10 * auVar84._8_4_ | (uint)!bVar10 * auVar92._8_4_);
            bVar10 = (bool)((byte)(uVar69 >> 3) & 1);
            auVar109._12_4_ =
                 (float)((uint)bVar10 * auVar84._12_4_ | (uint)!bVar10 * auVar92._12_4_);
            bVar10 = (bool)((byte)(uVar69 >> 4) & 1);
            auVar109._16_4_ =
                 (float)((uint)bVar10 * auVar84._16_4_ | (uint)!bVar10 * auVar92._16_4_);
            bVar10 = (bool)((byte)(uVar69 >> 5) & 1);
            auVar109._20_4_ =
                 (float)((uint)bVar10 * auVar84._20_4_ | (uint)!bVar10 * auVar92._20_4_);
            bVar10 = (bool)((byte)(uVar69 >> 6) & 1);
            auVar109._24_4_ =
                 (float)((uint)bVar10 * auVar84._24_4_ | (uint)!bVar10 * auVar92._24_4_);
            bVar10 = SUB81(uVar69 >> 7,0);
            auVar109._28_4_ = (uint)bVar10 * auVar84._28_4_ | (uint)!bVar10 * auVar92._28_4_;
            vandps_avx512vl(auVar94,auVar91);
            vandps_avx512vl(auVar90,auVar91);
            auVar96 = vmaxps_avx(auVar109,auVar109);
            vandps_avx512vl(auVar98,auVar91);
            auVar96 = vmaxps_avx(auVar96,auVar109);
            uVar69 = vcmpps_avx512vl(auVar96,auVar57,1);
            bVar10 = (bool)((byte)uVar69 & 1);
            auVar110._0_4_ = (uint)bVar10 * auVar86._0_4_ | (uint)!bVar10 * auVar94._0_4_;
            bVar10 = (bool)((byte)(uVar69 >> 1) & 1);
            auVar110._4_4_ = (uint)bVar10 * auVar86._4_4_ | (uint)!bVar10 * auVar94._4_4_;
            bVar10 = (bool)((byte)(uVar69 >> 2) & 1);
            auVar110._8_4_ = (uint)bVar10 * auVar86._8_4_ | (uint)!bVar10 * auVar94._8_4_;
            bVar10 = (bool)((byte)(uVar69 >> 3) & 1);
            auVar110._12_4_ = (uint)bVar10 * auVar86._12_4_ | (uint)!bVar10 * auVar94._12_4_;
            bVar10 = (bool)((byte)(uVar69 >> 4) & 1);
            auVar110._16_4_ = (uint)bVar10 * auVar86._16_4_ | (uint)!bVar10 * auVar94._16_4_;
            bVar10 = (bool)((byte)(uVar69 >> 5) & 1);
            auVar110._20_4_ = (uint)bVar10 * auVar86._20_4_ | (uint)!bVar10 * auVar94._20_4_;
            bVar10 = (bool)((byte)(uVar69 >> 6) & 1);
            auVar110._24_4_ = (uint)bVar10 * auVar86._24_4_ | (uint)!bVar10 * auVar94._24_4_;
            bVar10 = SUB81(uVar69 >> 7,0);
            auVar110._28_4_ = (uint)bVar10 * auVar86._28_4_ | (uint)!bVar10 * auVar94._28_4_;
            bVar10 = (bool)((byte)uVar69 & 1);
            auVar111._0_4_ = (float)((uint)bVar10 * auVar84._0_4_ | (uint)!bVar10 * auVar90._0_4_);
            bVar10 = (bool)((byte)(uVar69 >> 1) & 1);
            auVar111._4_4_ = (float)((uint)bVar10 * auVar84._4_4_ | (uint)!bVar10 * auVar90._4_4_);
            bVar10 = (bool)((byte)(uVar69 >> 2) & 1);
            auVar111._8_4_ = (float)((uint)bVar10 * auVar84._8_4_ | (uint)!bVar10 * auVar90._8_4_);
            bVar10 = (bool)((byte)(uVar69 >> 3) & 1);
            auVar111._12_4_ =
                 (float)((uint)bVar10 * auVar84._12_4_ | (uint)!bVar10 * auVar90._12_4_);
            bVar10 = (bool)((byte)(uVar69 >> 4) & 1);
            auVar111._16_4_ =
                 (float)((uint)bVar10 * auVar84._16_4_ | (uint)!bVar10 * auVar90._16_4_);
            bVar10 = (bool)((byte)(uVar69 >> 5) & 1);
            auVar111._20_4_ =
                 (float)((uint)bVar10 * auVar84._20_4_ | (uint)!bVar10 * auVar90._20_4_);
            bVar10 = (bool)((byte)(uVar69 >> 6) & 1);
            auVar111._24_4_ =
                 (float)((uint)bVar10 * auVar84._24_4_ | (uint)!bVar10 * auVar90._24_4_);
            bVar10 = SUB81(uVar69 >> 7,0);
            auVar111._28_4_ = (uint)bVar10 * auVar84._28_4_ | (uint)!bVar10 * auVar90._28_4_;
            auVar178._8_4_ = 0x80000000;
            auVar178._0_8_ = 0x8000000080000000;
            auVar178._12_4_ = 0x80000000;
            auVar178._16_4_ = 0x80000000;
            auVar178._20_4_ = 0x80000000;
            auVar178._24_4_ = 0x80000000;
            auVar178._28_4_ = 0x80000000;
            auVar96 = vxorps_avx512vl(auVar110,auVar178);
            auVar90 = auVar196._0_32_;
            auVar98 = vfmadd213ps_avx512vl(auVar108,auVar108,auVar90);
            auVar77 = vfmadd231ps_fma(auVar98,auVar109,auVar109);
            auVar98 = vrsqrt14ps_avx512vl(ZEXT1632(auVar77));
            auVar188._8_4_ = 0xbf000000;
            auVar188._0_8_ = 0xbf000000bf000000;
            auVar188._12_4_ = 0xbf000000;
            auVar188._16_4_ = 0xbf000000;
            auVar188._20_4_ = 0xbf000000;
            auVar188._24_4_ = 0xbf000000;
            auVar188._28_4_ = 0xbf000000;
            fVar150 = auVar98._0_4_;
            fVar136 = auVar98._4_4_;
            fVar137 = auVar98._8_4_;
            fVar138 = auVar98._12_4_;
            fVar168 = auVar98._16_4_;
            fVar171 = auVar98._20_4_;
            fVar70 = auVar98._24_4_;
            auVar40._4_4_ = fVar136 * fVar136 * fVar136 * auVar77._4_4_ * -0.5;
            auVar40._0_4_ = fVar150 * fVar150 * fVar150 * auVar77._0_4_ * -0.5;
            auVar40._8_4_ = fVar137 * fVar137 * fVar137 * auVar77._8_4_ * -0.5;
            auVar40._12_4_ = fVar138 * fVar138 * fVar138 * auVar77._12_4_ * -0.5;
            auVar40._16_4_ = fVar168 * fVar168 * fVar168 * -0.0;
            auVar40._20_4_ = fVar171 * fVar171 * fVar171 * -0.0;
            auVar40._24_4_ = fVar70 * fVar70 * fVar70 * -0.0;
            auVar40._28_4_ = auVar109._28_4_;
            auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar98 = vfmadd231ps_avx512vl(auVar40,auVar94,auVar98);
            auVar41._4_4_ = auVar109._4_4_ * auVar98._4_4_;
            auVar41._0_4_ = auVar109._0_4_ * auVar98._0_4_;
            auVar41._8_4_ = auVar109._8_4_ * auVar98._8_4_;
            auVar41._12_4_ = auVar109._12_4_ * auVar98._12_4_;
            auVar41._16_4_ = auVar109._16_4_ * auVar98._16_4_;
            auVar41._20_4_ = auVar109._20_4_ * auVar98._20_4_;
            auVar41._24_4_ = auVar109._24_4_ * auVar98._24_4_;
            auVar41._28_4_ = 0;
            auVar42._4_4_ = auVar98._4_4_ * -auVar108._4_4_;
            auVar42._0_4_ = auVar98._0_4_ * -auVar108._0_4_;
            auVar42._8_4_ = auVar98._8_4_ * -auVar108._8_4_;
            auVar42._12_4_ = auVar98._12_4_ * -auVar108._12_4_;
            auVar42._16_4_ = auVar98._16_4_ * -auVar108._16_4_;
            auVar42._20_4_ = auVar98._20_4_ * -auVar108._20_4_;
            auVar42._24_4_ = auVar98._24_4_ * -auVar108._24_4_;
            auVar42._28_4_ = auVar109._28_4_;
            auVar93 = vmulps_avx512vl(auVar98,auVar90);
            auVar98 = vfmadd213ps_avx512vl(auVar110,auVar110,auVar90);
            auVar98 = vfmadd231ps_avx512vl(auVar98,auVar111,auVar111);
            auVar92 = vrsqrt14ps_avx512vl(auVar98);
            auVar98 = vmulps_avx512vl(auVar98,auVar188);
            fVar150 = auVar92._0_4_;
            fVar136 = auVar92._4_4_;
            fVar137 = auVar92._8_4_;
            fVar138 = auVar92._12_4_;
            fVar168 = auVar92._16_4_;
            fVar171 = auVar92._20_4_;
            fVar70 = auVar92._24_4_;
            auVar43._4_4_ = fVar136 * fVar136 * fVar136 * auVar98._4_4_;
            auVar43._0_4_ = fVar150 * fVar150 * fVar150 * auVar98._0_4_;
            auVar43._8_4_ = fVar137 * fVar137 * fVar137 * auVar98._8_4_;
            auVar43._12_4_ = fVar138 * fVar138 * fVar138 * auVar98._12_4_;
            auVar43._16_4_ = fVar168 * fVar168 * fVar168 * auVar98._16_4_;
            auVar43._20_4_ = fVar171 * fVar171 * fVar171 * auVar98._20_4_;
            auVar43._24_4_ = fVar70 * fVar70 * fVar70 * auVar98._24_4_;
            auVar43._28_4_ = auVar98._28_4_;
            auVar98 = vfmadd231ps_avx512vl(auVar43,auVar94,auVar92);
            auVar44._4_4_ = auVar111._4_4_ * auVar98._4_4_;
            auVar44._0_4_ = auVar111._0_4_ * auVar98._0_4_;
            auVar44._8_4_ = auVar111._8_4_ * auVar98._8_4_;
            auVar44._12_4_ = auVar111._12_4_ * auVar98._12_4_;
            auVar44._16_4_ = auVar111._16_4_ * auVar98._16_4_;
            auVar44._20_4_ = auVar111._20_4_ * auVar98._20_4_;
            auVar44._24_4_ = auVar111._24_4_ * auVar98._24_4_;
            auVar44._28_4_ = auVar92._28_4_;
            auVar45._4_4_ = auVar98._4_4_ * auVar96._4_4_;
            auVar45._0_4_ = auVar98._0_4_ * auVar96._0_4_;
            auVar45._8_4_ = auVar98._8_4_ * auVar96._8_4_;
            auVar45._12_4_ = auVar98._12_4_ * auVar96._12_4_;
            auVar45._16_4_ = auVar98._16_4_ * auVar96._16_4_;
            auVar45._20_4_ = auVar98._20_4_ * auVar96._20_4_;
            auVar45._24_4_ = auVar98._24_4_ * auVar96._24_4_;
            auVar45._28_4_ = auVar96._28_4_;
            auVar96 = vmulps_avx512vl(auVar98,auVar90);
            auVar77 = vfmadd213ps_fma(auVar41,ZEXT1632(auVar76),auVar85);
            auVar98 = ZEXT1632(auVar76);
            auVar195 = vfmadd213ps_fma(auVar42,auVar98,auVar87);
            auVar94 = vfmadd213ps_avx512vl(auVar93,auVar98,auVar82);
            auVar92 = vfmadd213ps_avx512vl(auVar44,ZEXT1632(auVar75),auVar88);
            auVar20 = vfnmadd213ps_fma(auVar41,auVar98,auVar85);
            auVar83 = ZEXT1632(auVar75);
            auVar16 = vfmadd213ps_fma(auVar45,auVar83,auVar89);
            auVar78 = vfnmadd213ps_fma(auVar42,auVar98,auVar87);
            auVar17 = vfmadd213ps_fma(auVar96,auVar83,auVar81);
            auVar87 = ZEXT1632(auVar76);
            auVar25 = vfnmadd231ps_fma(auVar82,auVar87,auVar93);
            auVar79 = vfnmadd213ps_fma(auVar44,auVar83,auVar88);
            auVar24 = vfnmadd213ps_fma(auVar45,auVar83,auVar89);
            auVar80 = vfnmadd231ps_fma(auVar81,ZEXT1632(auVar75),auVar96);
            auVar81 = vsubps_avx512vl(auVar92,ZEXT1632(auVar20));
            auVar96 = vsubps_avx(ZEXT1632(auVar16),ZEXT1632(auVar78));
            auVar98 = vsubps_avx(ZEXT1632(auVar17),ZEXT1632(auVar25));
            auVar46._4_4_ = auVar96._4_4_ * auVar25._4_4_;
            auVar46._0_4_ = auVar96._0_4_ * auVar25._0_4_;
            auVar46._8_4_ = auVar96._8_4_ * auVar25._8_4_;
            auVar46._12_4_ = auVar96._12_4_ * auVar25._12_4_;
            auVar46._16_4_ = auVar96._16_4_ * 0.0;
            auVar46._20_4_ = auVar96._20_4_ * 0.0;
            auVar46._24_4_ = auVar96._24_4_ * 0.0;
            auVar46._28_4_ = auVar93._28_4_;
            auVar76 = vfmsub231ps_fma(auVar46,ZEXT1632(auVar78),auVar98);
            auVar47._4_4_ = auVar98._4_4_ * auVar20._4_4_;
            auVar47._0_4_ = auVar98._0_4_ * auVar20._0_4_;
            auVar47._8_4_ = auVar98._8_4_ * auVar20._8_4_;
            auVar47._12_4_ = auVar98._12_4_ * auVar20._12_4_;
            auVar47._16_4_ = auVar98._16_4_ * 0.0;
            auVar47._20_4_ = auVar98._20_4_ * 0.0;
            auVar47._24_4_ = auVar98._24_4_ * 0.0;
            auVar47._28_4_ = auVar98._28_4_;
            auVar18 = vfmsub231ps_fma(auVar47,ZEXT1632(auVar25),auVar81);
            auVar48._4_4_ = auVar78._4_4_ * auVar81._4_4_;
            auVar48._0_4_ = auVar78._0_4_ * auVar81._0_4_;
            auVar48._8_4_ = auVar78._8_4_ * auVar81._8_4_;
            auVar48._12_4_ = auVar78._12_4_ * auVar81._12_4_;
            auVar48._16_4_ = auVar81._16_4_ * 0.0;
            auVar48._20_4_ = auVar81._20_4_ * 0.0;
            auVar48._24_4_ = auVar81._24_4_ * 0.0;
            auVar48._28_4_ = auVar81._28_4_;
            auVar19 = vfmsub231ps_fma(auVar48,ZEXT1632(auVar20),auVar96);
            auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar19),auVar90,ZEXT1632(auVar18));
            auVar96 = vfmadd231ps_avx512vl(auVar96,auVar90,ZEXT1632(auVar76));
            uVar69 = vcmpps_avx512vl(auVar96,auVar90,2);
            bVar58 = (byte)uVar69;
            fVar119 = (float)((uint)(bVar58 & 1) * auVar77._0_4_ |
                             (uint)!(bool)(bVar58 & 1) * auVar79._0_4_);
            bVar10 = (bool)((byte)(uVar69 >> 1) & 1);
            fVar121 = (float)((uint)bVar10 * auVar77._4_4_ | (uint)!bVar10 * auVar79._4_4_);
            bVar10 = (bool)((byte)(uVar69 >> 2) & 1);
            fVar124 = (float)((uint)bVar10 * auVar77._8_4_ | (uint)!bVar10 * auVar79._8_4_);
            bVar10 = (bool)((byte)(uVar69 >> 3) & 1);
            fVar125 = (float)((uint)bVar10 * auVar77._12_4_ | (uint)!bVar10 * auVar79._12_4_);
            auVar83 = ZEXT1632(CONCAT412(fVar125,CONCAT48(fVar124,CONCAT44(fVar121,fVar119))));
            fVar120 = (float)((uint)(bVar58 & 1) * auVar195._0_4_ |
                             (uint)!(bool)(bVar58 & 1) * auVar24._0_4_);
            bVar10 = (bool)((byte)(uVar69 >> 1) & 1);
            fVar123 = (float)((uint)bVar10 * auVar195._4_4_ | (uint)!bVar10 * auVar24._4_4_);
            bVar10 = (bool)((byte)(uVar69 >> 2) & 1);
            fVar122 = (float)((uint)bVar10 * auVar195._8_4_ | (uint)!bVar10 * auVar24._8_4_);
            bVar10 = (bool)((byte)(uVar69 >> 3) & 1);
            fVar126 = (float)((uint)bVar10 * auVar195._12_4_ | (uint)!bVar10 * auVar24._12_4_);
            auVar86 = ZEXT1632(CONCAT412(fVar126,CONCAT48(fVar122,CONCAT44(fVar123,fVar120))));
            auVar112._0_4_ =
                 (float)((uint)(bVar58 & 1) * auVar94._0_4_ |
                        (uint)!(bool)(bVar58 & 1) * auVar80._0_4_);
            bVar10 = (bool)((byte)(uVar69 >> 1) & 1);
            auVar112._4_4_ = (float)((uint)bVar10 * auVar94._4_4_ | (uint)!bVar10 * auVar80._4_4_);
            bVar10 = (bool)((byte)(uVar69 >> 2) & 1);
            auVar112._8_4_ = (float)((uint)bVar10 * auVar94._8_4_ | (uint)!bVar10 * auVar80._8_4_);
            bVar10 = (bool)((byte)(uVar69 >> 3) & 1);
            auVar112._12_4_ =
                 (float)((uint)bVar10 * auVar94._12_4_ | (uint)!bVar10 * auVar80._12_4_);
            fVar137 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar94._16_4_);
            auVar112._16_4_ = fVar137;
            fVar150 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar94._20_4_);
            auVar112._20_4_ = fVar150;
            fVar136 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar94._24_4_);
            auVar112._24_4_ = fVar136;
            iVar1 = (uint)(byte)(uVar69 >> 7) * auVar94._28_4_;
            auVar112._28_4_ = iVar1;
            auVar96 = vblendmps_avx512vl(ZEXT1632(auVar20),auVar92);
            auVar113._0_4_ =
                 (uint)(bVar58 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar76._0_4_;
            bVar10 = (bool)((byte)(uVar69 >> 1) & 1);
            auVar113._4_4_ = (uint)bVar10 * auVar96._4_4_ | (uint)!bVar10 * auVar76._4_4_;
            bVar10 = (bool)((byte)(uVar69 >> 2) & 1);
            auVar113._8_4_ = (uint)bVar10 * auVar96._8_4_ | (uint)!bVar10 * auVar76._8_4_;
            bVar10 = (bool)((byte)(uVar69 >> 3) & 1);
            auVar113._12_4_ = (uint)bVar10 * auVar96._12_4_ | (uint)!bVar10 * auVar76._12_4_;
            auVar113._16_4_ = (uint)((byte)(uVar69 >> 4) & 1) * auVar96._16_4_;
            auVar113._20_4_ = (uint)((byte)(uVar69 >> 5) & 1) * auVar96._20_4_;
            auVar113._24_4_ = (uint)((byte)(uVar69 >> 6) & 1) * auVar96._24_4_;
            auVar113._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar96._28_4_;
            auVar96 = vblendmps_avx512vl(ZEXT1632(auVar78),ZEXT1632(auVar16));
            auVar114._0_4_ =
                 (float)((uint)(bVar58 & 1) * auVar96._0_4_ |
                        (uint)!(bool)(bVar58 & 1) * auVar77._0_4_);
            bVar10 = (bool)((byte)(uVar69 >> 1) & 1);
            auVar114._4_4_ = (float)((uint)bVar10 * auVar96._4_4_ | (uint)!bVar10 * auVar77._4_4_);
            bVar10 = (bool)((byte)(uVar69 >> 2) & 1);
            auVar114._8_4_ = (float)((uint)bVar10 * auVar96._8_4_ | (uint)!bVar10 * auVar77._8_4_);
            bVar10 = (bool)((byte)(uVar69 >> 3) & 1);
            auVar114._12_4_ =
                 (float)((uint)bVar10 * auVar96._12_4_ | (uint)!bVar10 * auVar77._12_4_);
            fVar138 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar96._16_4_);
            auVar114._16_4_ = fVar138;
            fVar168 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar96._20_4_);
            auVar114._20_4_ = fVar168;
            fVar171 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar96._24_4_);
            auVar114._24_4_ = fVar171;
            auVar114._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar96._28_4_;
            auVar96 = vblendmps_avx512vl(ZEXT1632(auVar25),ZEXT1632(auVar17));
            auVar115._0_4_ =
                 (float)((uint)(bVar58 & 1) * auVar96._0_4_ |
                        (uint)!(bool)(bVar58 & 1) * auVar195._0_4_);
            bVar10 = (bool)((byte)(uVar69 >> 1) & 1);
            auVar115._4_4_ = (float)((uint)bVar10 * auVar96._4_4_ | (uint)!bVar10 * auVar195._4_4_);
            bVar10 = (bool)((byte)(uVar69 >> 2) & 1);
            auVar115._8_4_ = (float)((uint)bVar10 * auVar96._8_4_ | (uint)!bVar10 * auVar195._8_4_);
            bVar10 = (bool)((byte)(uVar69 >> 3) & 1);
            auVar115._12_4_ =
                 (float)((uint)bVar10 * auVar96._12_4_ | (uint)!bVar10 * auVar195._12_4_);
            fVar71 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar96._16_4_);
            auVar115._16_4_ = fVar71;
            fVar118 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar96._20_4_);
            auVar115._20_4_ = fVar118;
            fVar70 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar96._24_4_);
            auVar115._24_4_ = fVar70;
            iVar2 = (uint)(byte)(uVar69 >> 7) * auVar96._28_4_;
            auVar115._28_4_ = iVar2;
            auVar116._0_4_ =
                 (uint)(bVar58 & 1) * (int)auVar20._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar92._0_4_
            ;
            bVar10 = (bool)((byte)(uVar69 >> 1) & 1);
            auVar116._4_4_ = (uint)bVar10 * (int)auVar20._4_4_ | (uint)!bVar10 * auVar92._4_4_;
            bVar10 = (bool)((byte)(uVar69 >> 2) & 1);
            auVar116._8_4_ = (uint)bVar10 * (int)auVar20._8_4_ | (uint)!bVar10 * auVar92._8_4_;
            bVar10 = (bool)((byte)(uVar69 >> 3) & 1);
            auVar116._12_4_ = (uint)bVar10 * (int)auVar20._12_4_ | (uint)!bVar10 * auVar92._12_4_;
            auVar116._16_4_ = (uint)!(bool)((byte)(uVar69 >> 4) & 1) * auVar92._16_4_;
            auVar116._20_4_ = (uint)!(bool)((byte)(uVar69 >> 5) & 1) * auVar92._20_4_;
            auVar116._24_4_ = (uint)!(bool)((byte)(uVar69 >> 6) & 1) * auVar92._24_4_;
            auVar116._28_4_ = (uint)!SUB81(uVar69 >> 7,0) * auVar92._28_4_;
            bVar10 = (bool)((byte)(uVar69 >> 1) & 1);
            bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
            bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
            bVar11 = (bool)((byte)(uVar69 >> 1) & 1);
            bVar13 = (bool)((byte)(uVar69 >> 2) & 1);
            bVar15 = (bool)((byte)(uVar69 >> 3) & 1);
            auVar92 = vsubps_avx512vl(auVar116,auVar83);
            auVar98 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar14 * (int)auVar78._12_4_ |
                                                    (uint)!bVar14 * auVar16._12_4_,
                                                    CONCAT48((uint)bVar12 * (int)auVar78._8_4_ |
                                                             (uint)!bVar12 * auVar16._8_4_,
                                                             CONCAT44((uint)bVar10 *
                                                                      (int)auVar78._4_4_ |
                                                                      (uint)!bVar10 * auVar16._4_4_,
                                                                      (uint)(bVar58 & 1) *
                                                                      (int)auVar78._0_4_ |
                                                                      (uint)!(bool)(bVar58 & 1) *
                                                                      auVar16._0_4_)))),auVar86);
            auVar94 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar25._12_4_ |
                                                    (uint)!bVar15 * auVar17._12_4_,
                                                    CONCAT48((uint)bVar13 * (int)auVar25._8_4_ |
                                                             (uint)!bVar13 * auVar17._8_4_,
                                                             CONCAT44((uint)bVar11 *
                                                                      (int)auVar25._4_4_ |
                                                                      (uint)!bVar11 * auVar17._4_4_,
                                                                      (uint)(bVar58 & 1) *
                                                                      (int)auVar25._0_4_ |
                                                                      (uint)!(bool)(bVar58 & 1) *
                                                                      auVar17._0_4_)))),auVar112);
            auVar93 = vsubps_avx(auVar83,auVar113);
            auVar81 = vsubps_avx(auVar86,auVar114);
            auVar82 = vsubps_avx(auVar112,auVar115);
            auVar49._4_4_ = auVar94._4_4_ * fVar121;
            auVar49._0_4_ = auVar94._0_4_ * fVar119;
            auVar49._8_4_ = auVar94._8_4_ * fVar124;
            auVar49._12_4_ = auVar94._12_4_ * fVar125;
            auVar49._16_4_ = auVar94._16_4_ * 0.0;
            auVar49._20_4_ = auVar94._20_4_ * 0.0;
            auVar49._24_4_ = auVar94._24_4_ * 0.0;
            auVar49._28_4_ = 0;
            auVar76 = vfmsub231ps_fma(auVar49,auVar112,auVar92);
            auVar154._0_4_ = fVar120 * auVar92._0_4_;
            auVar154._4_4_ = fVar123 * auVar92._4_4_;
            auVar154._8_4_ = fVar122 * auVar92._8_4_;
            auVar154._12_4_ = fVar126 * auVar92._12_4_;
            auVar154._16_4_ = auVar92._16_4_ * 0.0;
            auVar154._20_4_ = auVar92._20_4_ * 0.0;
            auVar154._24_4_ = auVar92._24_4_ * 0.0;
            auVar154._28_4_ = 0;
            auVar77 = vfmsub231ps_fma(auVar154,auVar83,auVar98);
            auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar77),auVar90,ZEXT1632(auVar76));
            auVar163._0_4_ = auVar98._0_4_ * auVar112._0_4_;
            auVar163._4_4_ = auVar98._4_4_ * auVar112._4_4_;
            auVar163._8_4_ = auVar98._8_4_ * auVar112._8_4_;
            auVar163._12_4_ = auVar98._12_4_ * auVar112._12_4_;
            auVar163._16_4_ = auVar98._16_4_ * fVar137;
            auVar163._20_4_ = auVar98._20_4_ * fVar150;
            auVar163._24_4_ = auVar98._24_4_ * fVar136;
            auVar163._28_4_ = 0;
            auVar76 = vfmsub231ps_fma(auVar163,auVar86,auVar94);
            auVar84 = vfmadd231ps_avx512vl(auVar96,auVar90,ZEXT1632(auVar76));
            auVar96 = vmulps_avx512vl(auVar82,auVar113);
            auVar96 = vfmsub231ps_avx512vl(auVar96,auVar93,auVar115);
            auVar50._4_4_ = auVar81._4_4_ * auVar115._4_4_;
            auVar50._0_4_ = auVar81._0_4_ * auVar115._0_4_;
            auVar50._8_4_ = auVar81._8_4_ * auVar115._8_4_;
            auVar50._12_4_ = auVar81._12_4_ * auVar115._12_4_;
            auVar50._16_4_ = auVar81._16_4_ * fVar71;
            auVar50._20_4_ = auVar81._20_4_ * fVar118;
            auVar50._24_4_ = auVar81._24_4_ * fVar70;
            auVar50._28_4_ = iVar2;
            auVar76 = vfmsub231ps_fma(auVar50,auVar114,auVar82);
            auVar164._0_4_ = auVar114._0_4_ * auVar93._0_4_;
            auVar164._4_4_ = auVar114._4_4_ * auVar93._4_4_;
            auVar164._8_4_ = auVar114._8_4_ * auVar93._8_4_;
            auVar164._12_4_ = auVar114._12_4_ * auVar93._12_4_;
            auVar164._16_4_ = fVar138 * auVar93._16_4_;
            auVar164._20_4_ = fVar168 * auVar93._20_4_;
            auVar164._24_4_ = fVar171 * auVar93._24_4_;
            auVar164._28_4_ = 0;
            auVar77 = vfmsub231ps_fma(auVar164,auVar81,auVar113);
            auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar77),auVar90,auVar96);
            auVar85 = vfmadd231ps_avx512vl(auVar96,auVar90,ZEXT1632(auVar76));
            auVar96 = vmaxps_avx(auVar84,auVar85);
            uVar139 = vcmpps_avx512vl(auVar96,auVar90,2);
            bVar67 = bVar67 & (byte)uVar139;
            if (bVar67 != 0) {
              uVar127 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar184._4_4_ = uVar127;
              auVar184._0_4_ = uVar127;
              auVar184._8_4_ = uVar127;
              auVar184._12_4_ = uVar127;
              auVar184._16_4_ = uVar127;
              auVar184._20_4_ = uVar127;
              auVar184._24_4_ = uVar127;
              auVar184._28_4_ = uVar127;
              auVar185 = ZEXT3264(auVar184);
              auVar51._4_4_ = auVar82._4_4_ * auVar98._4_4_;
              auVar51._0_4_ = auVar82._0_4_ * auVar98._0_4_;
              auVar51._8_4_ = auVar82._8_4_ * auVar98._8_4_;
              auVar51._12_4_ = auVar82._12_4_ * auVar98._12_4_;
              auVar51._16_4_ = auVar82._16_4_ * auVar98._16_4_;
              auVar51._20_4_ = auVar82._20_4_ * auVar98._20_4_;
              auVar51._24_4_ = auVar82._24_4_ * auVar98._24_4_;
              auVar51._28_4_ = auVar96._28_4_;
              auVar195 = vfmsub231ps_fma(auVar51,auVar81,auVar94);
              auVar52._4_4_ = auVar94._4_4_ * auVar93._4_4_;
              auVar52._0_4_ = auVar94._0_4_ * auVar93._0_4_;
              auVar52._8_4_ = auVar94._8_4_ * auVar93._8_4_;
              auVar52._12_4_ = auVar94._12_4_ * auVar93._12_4_;
              auVar52._16_4_ = auVar94._16_4_ * auVar93._16_4_;
              auVar52._20_4_ = auVar94._20_4_ * auVar93._20_4_;
              auVar52._24_4_ = auVar94._24_4_ * auVar93._24_4_;
              auVar52._28_4_ = auVar94._28_4_;
              auVar77 = vfmsub231ps_fma(auVar52,auVar92,auVar82);
              auVar53._4_4_ = auVar81._4_4_ * auVar92._4_4_;
              auVar53._0_4_ = auVar81._0_4_ * auVar92._0_4_;
              auVar53._8_4_ = auVar81._8_4_ * auVar92._8_4_;
              auVar53._12_4_ = auVar81._12_4_ * auVar92._12_4_;
              auVar53._16_4_ = auVar81._16_4_ * auVar92._16_4_;
              auVar53._20_4_ = auVar81._20_4_ * auVar92._20_4_;
              auVar53._24_4_ = auVar81._24_4_ * auVar92._24_4_;
              auVar53._28_4_ = auVar81._28_4_;
              auVar16 = vfmsub231ps_fma(auVar53,auVar93,auVar98);
              auVar76 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar77),ZEXT1632(auVar16));
              auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar76),ZEXT1632(auVar195),auVar90);
              auVar98 = vrcp14ps_avx512vl(auVar96);
              auVar93 = auVar192._0_32_;
              auVar94 = vfnmadd213ps_avx512vl(auVar98,auVar96,auVar93);
              auVar76 = vfmadd132ps_fma(auVar94,auVar98,auVar98);
              auVar54._4_4_ = auVar16._4_4_ * auVar112._4_4_;
              auVar54._0_4_ = auVar16._0_4_ * auVar112._0_4_;
              auVar54._8_4_ = auVar16._8_4_ * auVar112._8_4_;
              auVar54._12_4_ = auVar16._12_4_ * auVar112._12_4_;
              auVar54._16_4_ = fVar137 * 0.0;
              auVar54._20_4_ = fVar150 * 0.0;
              auVar54._24_4_ = fVar136 * 0.0;
              auVar54._28_4_ = iVar1;
              auVar77 = vfmadd231ps_fma(auVar54,auVar86,ZEXT1632(auVar77));
              auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar83,ZEXT1632(auVar195));
              fVar150 = auVar76._0_4_;
              fVar136 = auVar76._4_4_;
              fVar137 = auVar76._8_4_;
              fVar138 = auVar76._12_4_;
              local_240 = ZEXT1632(CONCAT412(auVar77._12_4_ * fVar138,
                                             CONCAT48(auVar77._8_4_ * fVar137,
                                                      CONCAT44(auVar77._4_4_ * fVar136,
                                                               auVar77._0_4_ * fVar150))));
              uVar139 = vcmpps_avx512vl(local_240,auVar184,2);
              auVar56._4_4_ = uStack_39c;
              auVar56._0_4_ = local_3a0;
              auVar56._8_4_ = uStack_398;
              auVar56._12_4_ = uStack_394;
              auVar56._16_4_ = uStack_390;
              auVar56._20_4_ = uStack_38c;
              auVar56._24_4_ = uStack_388;
              auVar56._28_4_ = uStack_384;
              uVar21 = vcmpps_avx512vl(local_240,auVar56,0xd);
              bVar67 = (byte)uVar139 & (byte)uVar21 & bVar67;
              if (bVar67 != 0) {
                uVar139 = vcmpps_avx512vl(auVar96,auVar90,4);
                bVar67 = bVar67 & (byte)uVar139;
                auVar200 = ZEXT3264(local_580);
                auVar191 = ZEXT3264(local_5a0);
                if (bVar67 != 0) {
                  fVar168 = auVar84._0_4_ * fVar150;
                  fVar171 = auVar84._4_4_ * fVar136;
                  auVar55._4_4_ = fVar171;
                  auVar55._0_4_ = fVar168;
                  fVar70 = auVar84._8_4_ * fVar137;
                  auVar55._8_4_ = fVar70;
                  fVar71 = auVar84._12_4_ * fVar138;
                  auVar55._12_4_ = fVar71;
                  fVar118 = auVar84._16_4_ * 0.0;
                  auVar55._16_4_ = fVar118;
                  fVar119 = auVar84._20_4_ * 0.0;
                  auVar55._20_4_ = fVar119;
                  fVar120 = auVar84._24_4_ * 0.0;
                  auVar55._24_4_ = fVar120;
                  auVar55._28_4_ = auVar96._28_4_;
                  auVar98 = vsubps_avx512vl(auVar93,auVar55);
                  local_280._0_4_ =
                       (float)((uint)(bVar58 & 1) * (int)fVar168 |
                              (uint)!(bool)(bVar58 & 1) * auVar98._0_4_);
                  bVar10 = (bool)((byte)(uVar69 >> 1) & 1);
                  local_280._4_4_ =
                       (float)((uint)bVar10 * (int)fVar171 | (uint)!bVar10 * auVar98._4_4_);
                  bVar10 = (bool)((byte)(uVar69 >> 2) & 1);
                  local_280._8_4_ =
                       (float)((uint)bVar10 * (int)fVar70 | (uint)!bVar10 * auVar98._8_4_);
                  bVar10 = (bool)((byte)(uVar69 >> 3) & 1);
                  local_280._12_4_ =
                       (float)((uint)bVar10 * (int)fVar71 | (uint)!bVar10 * auVar98._12_4_);
                  bVar10 = (bool)((byte)(uVar69 >> 4) & 1);
                  local_280._16_4_ =
                       (float)((uint)bVar10 * (int)fVar118 | (uint)!bVar10 * auVar98._16_4_);
                  bVar10 = (bool)((byte)(uVar69 >> 5) & 1);
                  local_280._20_4_ =
                       (float)((uint)bVar10 * (int)fVar119 | (uint)!bVar10 * auVar98._20_4_);
                  bVar10 = (bool)((byte)(uVar69 >> 6) & 1);
                  local_280._24_4_ =
                       (float)((uint)bVar10 * (int)fVar120 | (uint)!bVar10 * auVar98._24_4_);
                  bVar10 = SUB81(uVar69 >> 7,0);
                  local_280._28_4_ =
                       (float)((uint)bVar10 * auVar96._28_4_ | (uint)!bVar10 * auVar98._28_4_);
                  auVar96 = vsubps_avx(ZEXT1632(auVar75),auVar87);
                  auVar76 = vfmadd213ps_fma(auVar96,local_280,auVar87);
                  uVar127 = *(undefined4 *)((long)local_5d8->ray_space + k * 4 + -0x10);
                  auVar31._4_4_ = uVar127;
                  auVar31._0_4_ = uVar127;
                  auVar31._8_4_ = uVar127;
                  auVar31._12_4_ = uVar127;
                  auVar31._16_4_ = uVar127;
                  auVar31._20_4_ = uVar127;
                  auVar31._24_4_ = uVar127;
                  auVar31._28_4_ = uVar127;
                  auVar96 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar76._12_4_ + auVar76._12_4_,
                                                               CONCAT48(auVar76._8_4_ +
                                                                        auVar76._8_4_,
                                                                        CONCAT44(auVar76._4_4_ +
                                                                                 auVar76._4_4_,
                                                                                 auVar76._0_4_ +
                                                                                 auVar76._0_4_)))),
                                            auVar31);
                  uVar139 = vcmpps_avx512vl(local_240,auVar96,6);
                  if (((byte)uVar139 & bVar67) != 0) {
                    auVar144._0_4_ = auVar85._0_4_ * fVar150;
                    auVar144._4_4_ = auVar85._4_4_ * fVar136;
                    auVar144._8_4_ = auVar85._8_4_ * fVar137;
                    auVar144._12_4_ = auVar85._12_4_ * fVar138;
                    auVar144._16_4_ = auVar85._16_4_ * 0.0;
                    auVar144._20_4_ = auVar85._20_4_ * 0.0;
                    auVar144._24_4_ = auVar85._24_4_ * 0.0;
                    auVar144._28_4_ = 0;
                    auVar96 = vsubps_avx512vl(auVar93,auVar144);
                    auVar117._0_4_ =
                         (uint)(bVar58 & 1) * (int)auVar144._0_4_ |
                         (uint)!(bool)(bVar58 & 1) * auVar96._0_4_;
                    bVar10 = (bool)((byte)(uVar69 >> 1) & 1);
                    auVar117._4_4_ =
                         (uint)bVar10 * (int)auVar144._4_4_ | (uint)!bVar10 * auVar96._4_4_;
                    bVar10 = (bool)((byte)(uVar69 >> 2) & 1);
                    auVar117._8_4_ =
                         (uint)bVar10 * (int)auVar144._8_4_ | (uint)!bVar10 * auVar96._8_4_;
                    bVar10 = (bool)((byte)(uVar69 >> 3) & 1);
                    auVar117._12_4_ =
                         (uint)bVar10 * (int)auVar144._12_4_ | (uint)!bVar10 * auVar96._12_4_;
                    bVar10 = (bool)((byte)(uVar69 >> 4) & 1);
                    auVar117._16_4_ =
                         (uint)bVar10 * (int)auVar144._16_4_ | (uint)!bVar10 * auVar96._16_4_;
                    bVar10 = (bool)((byte)(uVar69 >> 5) & 1);
                    auVar117._20_4_ =
                         (uint)bVar10 * (int)auVar144._20_4_ | (uint)!bVar10 * auVar96._20_4_;
                    bVar10 = (bool)((byte)(uVar69 >> 6) & 1);
                    auVar117._24_4_ =
                         (uint)bVar10 * (int)auVar144._24_4_ | (uint)!bVar10 * auVar96._24_4_;
                    auVar117._28_4_ = (uint)!SUB81(uVar69 >> 7,0) * auVar96._28_4_;
                    auVar32._8_4_ = 0x40000000;
                    auVar32._0_8_ = 0x4000000040000000;
                    auVar32._12_4_ = 0x40000000;
                    auVar32._16_4_ = 0x40000000;
                    auVar32._20_4_ = 0x40000000;
                    auVar32._24_4_ = 0x40000000;
                    auVar32._28_4_ = 0x40000000;
                    local_260 = vfmsub132ps_avx512vl(auVar117,auVar93,auVar32);
                    local_220 = (undefined4)lVar65;
                    local_210 = local_510._0_8_;
                    uStack_208 = local_510._8_8_;
                    local_200 = local_520._0_8_;
                    uStack_1f8 = local_520._8_8_;
                    local_1f0 = local_530._0_8_;
                    uStack_1e8 = local_530._8_8_;
                    pGVar63 = (context->scene->geometries).items[local_5f8].ptr;
                    if ((pGVar63->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                      bVar58 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar58 = 1, pGVar63->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar76 = vcvtsi2ss_avx512f(auVar91._0_16_,local_220);
                      fVar150 = auVar76._0_4_;
                      local_1c0[0] = (fVar150 + local_280._0_4_ + 0.0) * (float)local_2c0._0_4_;
                      local_1c0[1] = (fVar150 + local_280._4_4_ + 1.0) * (float)local_2c0._4_4_;
                      local_1c0[2] = (fVar150 + local_280._8_4_ + 2.0) * fStack_2b8;
                      local_1c0[3] = (fVar150 + local_280._12_4_ + 3.0) * fStack_2b4;
                      fStack_1b0 = (fVar150 + local_280._16_4_ + 4.0) * fStack_2b0;
                      fStack_1ac = (fVar150 + local_280._20_4_ + 5.0) * fStack_2ac;
                      fStack_1a8 = (fVar150 + local_280._24_4_ + 6.0) * fStack_2a8;
                      fStack_1a4 = fVar150 + local_280._28_4_ + 7.0;
                      local_1a0 = local_260;
                      local_180 = local_240;
                      lVar59 = 0;
                      uVar68 = (ulong)((byte)uVar139 & bVar67);
                      for (uVar69 = uVar68; (uVar69 & 1) == 0;
                          uVar69 = uVar69 >> 1 | 0x8000000000000000) {
                        lVar59 = lVar59 + 1;
                      }
                      local_3e0._0_4_ = (int)uVar61;
                      local_160 = auVar184;
                      local_5e0 = pGVar63;
                      local_21c = iVar7;
                      do {
                        auVar195 = auVar196._0_16_;
                        fVar150 = local_1c0[lVar59];
                        local_320._4_4_ = fVar150;
                        local_320._0_4_ = fVar150;
                        local_320._8_4_ = fVar150;
                        local_320._12_4_ = fVar150;
                        local_480._0_8_ = lVar59;
                        local_310 = *(undefined4 *)(local_1a0 + lVar59 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x80) =
                             *(undefined4 *)(local_180 + lVar59 * 4);
                        local_5d0.context = context->user;
                        fVar136 = 1.0 - fVar150;
                        auVar29._8_4_ = 0x80000000;
                        auVar29._0_8_ = 0x8000000080000000;
                        auVar29._12_4_ = 0x80000000;
                        auVar77 = vxorps_avx512vl(ZEXT416((uint)fVar136),auVar29);
                        auVar76 = ZEXT416((uint)(fVar150 * fVar136 * 4.0));
                        auVar75 = vfnmsub213ss_fma(local_320,local_320,auVar76);
                        auVar76 = vfmadd213ss_fma(ZEXT416((uint)fVar136),ZEXT416((uint)fVar136),
                                                  auVar76);
                        fVar136 = fVar136 * auVar77._0_4_ * 0.5;
                        fVar137 = auVar75._0_4_ * 0.5;
                        fVar138 = auVar76._0_4_ * 0.5;
                        fVar150 = fVar150 * fVar150 * 0.5;
                        auVar159._0_4_ = fVar150 * (float)local_3b0._0_4_;
                        auVar159._4_4_ = fVar150 * (float)local_3b0._4_4_;
                        auVar159._8_4_ = fVar150 * fStack_3a8;
                        auVar159._12_4_ = fVar150 * fStack_3a4;
                        auVar134._4_4_ = fVar138;
                        auVar134._0_4_ = fVar138;
                        auVar134._8_4_ = fVar138;
                        auVar134._12_4_ = fVar138;
                        auVar76 = vfmadd132ps_fma(auVar134,auVar159,local_530);
                        auVar160._4_4_ = fVar137;
                        auVar160._0_4_ = fVar137;
                        auVar160._8_4_ = fVar137;
                        auVar160._12_4_ = fVar137;
                        auVar76 = vfmadd132ps_fma(auVar160,auVar76,local_520);
                        auVar135._4_4_ = fVar136;
                        auVar135._0_4_ = fVar136;
                        auVar135._8_4_ = fVar136;
                        auVar135._12_4_ = fVar136;
                        auVar76 = vfmadd132ps_fma(auVar135,auVar76,local_510);
                        local_350 = auVar76._0_4_;
                        local_340 = vshufps_avx(auVar76,auVar76,0x55);
                        local_330 = vshufps_avx(auVar76,auVar76,0xaa);
                        local_300 = local_540._0_8_;
                        uStack_2f8 = local_540._8_8_;
                        local_2f0 = local_550;
                        vpcmpeqd_avx2(ZEXT1632(local_550),ZEXT1632(local_550));
                        uStack_2dc = (local_5d0.context)->instID[0];
                        local_2e0 = uStack_2dc;
                        uStack_2d8 = uStack_2dc;
                        uStack_2d4 = uStack_2dc;
                        uStack_2d0 = (local_5d0.context)->instPrimID[0];
                        uStack_2cc = uStack_2d0;
                        uStack_2c8 = uStack_2d0;
                        uStack_2c4 = uStack_2d0;
                        local_610 = local_3c0;
                        local_5d0.valid = (int *)local_610;
                        local_5d0.geometryUserPtr = pGVar63->userPtr;
                        local_5d0.hit = (RTCHitN *)&local_350;
                        local_5d0.N = 4;
                        local_5f0._0_8_ = uVar68;
                        local_5d0.ray = (RTCRayN *)ray;
                        uStack_34c = local_350;
                        uStack_348 = local_350;
                        uStack_344 = local_350;
                        uStack_30c = local_310;
                        uStack_308 = local_310;
                        uStack_304 = local_310;
                        if (pGVar63->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar63->occlusionFilterN)(&local_5d0);
                          auVar185 = ZEXT3264(local_160);
                          uVar61 = (ulong)(uint)local_3e0._0_4_;
                          auVar191 = ZEXT3264(local_5a0);
                          auVar200 = ZEXT3264(local_580);
                          auVar194 = ZEXT3264(local_420);
                          auVar193 = ZEXT3264(local_400);
                          auVar76 = vxorps_avx512vl(auVar195,auVar195);
                          auVar196 = ZEXT1664(auVar76);
                          pGVar63 = local_5e0;
                          uVar68 = local_5f0._0_8_;
                        }
                        auVar76 = auVar196._0_16_;
                        uVar69 = vptestmd_avx512vl(local_610,local_610);
                        if ((uVar69 & 0xf) == 0) {
                          auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar192 = ZEXT3264(auVar96);
                          auVar201 = ZEXT3264(local_4a0);
                          auVar197 = ZEXT3264(local_4c0);
                          auVar198 = ZEXT3264(local_4e0);
                          auVar199 = ZEXT3264(local_500);
                        }
                        else {
                          p_Var9 = context->args->filter;
                          if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar63->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var9)(&local_5d0);
                            auVar185 = ZEXT3264(local_160);
                            uVar61 = (ulong)(uint)local_3e0._0_4_;
                            auVar191 = ZEXT3264(local_5a0);
                            auVar200 = ZEXT3264(local_580);
                            auVar194 = ZEXT3264(local_420);
                            auVar193 = ZEXT3264(local_400);
                            auVar76 = vxorps_avx512vl(auVar76,auVar76);
                            auVar196 = ZEXT1664(auVar76);
                            pGVar63 = local_5e0;
                            uVar68 = local_5f0._0_8_;
                          }
                          uVar69 = vptestmd_avx512vl(local_610,local_610);
                          uVar69 = uVar69 & 0xf;
                          auVar76 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar10 = (bool)((byte)uVar69 & 1);
                          bVar11 = (bool)((byte)(uVar69 >> 1) & 1);
                          bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
                          bVar13 = SUB81(uVar69 >> 3,0);
                          *(uint *)(local_5d0.ray + 0x80) =
                               (uint)bVar10 * auVar76._0_4_ |
                               (uint)!bVar10 * *(int *)(local_5d0.ray + 0x80);
                          *(uint *)(local_5d0.ray + 0x84) =
                               (uint)bVar11 * auVar76._4_4_ |
                               (uint)!bVar11 * *(int *)(local_5d0.ray + 0x84);
                          *(uint *)(local_5d0.ray + 0x88) =
                               (uint)bVar12 * auVar76._8_4_ |
                               (uint)!bVar12 * *(int *)(local_5d0.ray + 0x88);
                          *(uint *)(local_5d0.ray + 0x8c) =
                               (uint)bVar13 * auVar76._12_4_ |
                               (uint)!bVar13 * *(int *)(local_5d0.ray + 0x8c);
                          auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar192 = ZEXT3264(auVar96);
                          auVar201 = ZEXT3264(local_4a0);
                          auVar197 = ZEXT3264(local_4c0);
                          auVar198 = ZEXT3264(local_4e0);
                          auVar199 = ZEXT3264(local_500);
                          if ((byte)uVar69 != 0) {
                            bVar58 = 1;
                            break;
                          }
                        }
                        *(int *)(ray + k * 4 + 0x80) = auVar185._0_4_;
                        bVar58 = 0;
                        lVar59 = 0;
                        uVar68 = uVar68 ^ 1L << (local_480._0_8_ & 0x3f);
                        for (uVar69 = uVar68; (uVar69 & 1) == 0;
                            uVar69 = uVar69 >> 1 | 0x8000000000000000) {
                          lVar59 = lVar59 + 1;
                        }
                      } while (uVar68 != 0);
                    }
                    uVar61 = CONCAT71((int7)(uVar61 >> 8),(byte)uVar61 | bVar58);
                  }
                }
                goto LAB_01bb754d;
              }
            }
            auVar200 = ZEXT3264(local_580);
            auVar191 = ZEXT3264(local_5a0);
          }
LAB_01bb754d:
          lVar65 = lVar65 + 8;
        } while ((int)lVar65 < iVar7);
      }
      bVar67 = (byte)uVar61;
      if ((uVar61 & 1) != 0) break;
      uVar127 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar28._4_4_ = uVar127;
      auVar28._0_4_ = uVar127;
      auVar28._8_4_ = uVar127;
      auVar28._12_4_ = uVar127;
      uVar139 = vcmpps_avx512vl(local_290,auVar28,2);
      uVar64 = (uint)uVar66 & (uint)uVar66 + 0xf & (uint)uVar139;
      uVar66 = (ulong)uVar64;
    } while (uVar64 != 0);
  }
  return (bool)(bVar67 & 1);
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }